

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_intersector.h
# Opt level: O3

bool embree::avx2::CurveNiIntersectorK<4,8>::
     occluded_t<embree::avx2::SweepCurve1IntersectorK<embree::CatmullRomCurveT,8>,embree::avx2::Occluded1KEpilog1<8,true>>
               (Precalculations *pre,RayK<8> *ray,size_t k,RayQueryContext *context,Primitive *prim)

{
  undefined8 uVar1;
  Primitive PVar2;
  Geometry *pGVar3;
  RTCFilterFunctionN p_Var4;
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  int iVar20;
  long lVar21;
  undefined1 auVar22 [32];
  undefined1 auVar23 [32];
  undefined1 auVar24 [32];
  undefined1 auVar25 [32];
  undefined1 auVar26 [32];
  undefined1 auVar27 [32];
  undefined1 auVar28 [32];
  undefined1 auVar29 [32];
  undefined1 auVar30 [32];
  undefined1 auVar31 [32];
  undefined1 auVar32 [32];
  undefined1 auVar33 [32];
  undefined1 auVar34 [32];
  undefined1 auVar35 [32];
  undefined1 auVar36 [32];
  undefined1 auVar37 [32];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar41 [32];
  undefined1 auVar42 [32];
  undefined1 auVar43 [32];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar48 [32];
  undefined1 auVar49 [32];
  undefined1 auVar50 [32];
  undefined1 auVar51 [32];
  undefined1 auVar52 [32];
  undefined1 auVar53 [32];
  undefined1 auVar54 [32];
  undefined1 auVar55 [32];
  undefined1 auVar56 [32];
  undefined1 auVar57 [12];
  undefined1 auVar58 [32];
  undefined1 auVar59 [32];
  undefined1 auVar60 [32];
  undefined1 auVar61 [32];
  undefined1 auVar62 [32];
  undefined1 auVar63 [32];
  undefined1 auVar64 [32];
  undefined1 auVar65 [32];
  undefined1 auVar66 [32];
  undefined1 auVar67 [32];
  undefined1 auVar68 [32];
  undefined1 auVar69 [32];
  undefined1 auVar70 [32];
  undefined1 auVar71 [32];
  undefined1 auVar72 [32];
  undefined1 auVar73 [32];
  undefined1 auVar74 [32];
  undefined1 auVar75 [32];
  undefined1 auVar76 [32];
  undefined1 auVar77 [32];
  undefined1 auVar78 [32];
  undefined1 auVar79 [32];
  undefined1 auVar80 [32];
  undefined1 auVar81 [32];
  undefined1 auVar82 [32];
  undefined1 auVar83 [32];
  undefined1 auVar84 [32];
  undefined1 auVar85 [32];
  undefined1 auVar86 [32];
  byte bVar87;
  uint uVar88;
  int iVar89;
  undefined1 (*pauVar90) [32];
  uint uVar91;
  uint uVar92;
  ulong uVar93;
  ulong uVar94;
  ulong uVar95;
  bool bVar96;
  bool bVar97;
  float fVar98;
  float fVar100;
  float fVar134;
  float fVar135;
  vint4 bi_2;
  undefined1 auVar101 [16];
  undefined1 auVar102 [16];
  undefined1 auVar103 [16];
  undefined1 auVar104 [16];
  undefined1 auVar106 [16];
  undefined1 auVar107 [16];
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar110 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar113 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [32];
  undefined1 auVar118 [32];
  undefined4 uVar99;
  undefined1 auVar119 [32];
  undefined1 auVar120 [32];
  undefined1 auVar121 [32];
  undefined1 auVar122 [32];
  undefined1 auVar123 [32];
  undefined1 auVar124 [32];
  undefined1 auVar125 [32];
  undefined1 auVar126 [32];
  undefined1 auVar127 [32];
  undefined1 auVar128 [32];
  undefined1 auVar105 [16];
  undefined1 auVar129 [32];
  undefined1 auVar130 [32];
  undefined1 auVar131 [32];
  undefined1 auVar132 [32];
  undefined1 auVar133 [32];
  undefined1 extraout_var [60];
  undefined1 extraout_var_00 [60];
  vint4 bi_1;
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  undefined1 auVar144 [16];
  undefined1 auVar145 [16];
  undefined1 auVar146 [16];
  undefined1 auVar147 [32];
  undefined1 auVar148 [32];
  undefined1 auVar149 [32];
  undefined1 auVar150 [32];
  undefined1 auVar161 [16];
  undefined1 auVar162 [16];
  undefined1 auVar163 [16];
  undefined1 auVar164 [16];
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  undefined1 auVar167 [16];
  undefined1 auVar168 [16];
  undefined1 auVar169 [16];
  undefined1 auVar170 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar151 [32];
  undefined1 auVar152 [32];
  undefined1 auVar153 [32];
  undefined1 auVar154 [32];
  undefined1 auVar155 [32];
  undefined1 auVar156 [32];
  undefined1 auVar157 [32];
  undefined1 auVar158 [64];
  undefined1 auVar159 [64];
  undefined1 auVar160 [16];
  undefined1 auVar173 [32];
  undefined1 auVar174 [32];
  undefined1 auVar175 [32];
  undefined1 auVar176 [32];
  undefined1 auVar177 [32];
  undefined1 auVar178 [32];
  undefined1 auVar179 [32];
  undefined1 auVar180 [32];
  undefined1 auVar181 [32];
  undefined1 auVar182 [32];
  undefined1 auVar183 [32];
  undefined1 auVar184 [32];
  undefined1 auVar185 [64];
  vint4 ai_2;
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  undefined1 auVar192 [16];
  undefined1 auVar193 [16];
  undefined1 auVar194 [16];
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [32];
  undefined1 auVar199 [32];
  undefined1 auVar200 [32];
  undefined1 auVar201 [32];
  undefined1 auVar202 [32];
  float fVar203;
  vint4 ai;
  undefined1 auVar205 [16];
  undefined1 auVar206 [16];
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar204 [16];
  float fVar214;
  float fVar215;
  float fVar216;
  undefined1 auVar211 [32];
  undefined1 auVar212 [32];
  undefined1 auVar213 [32];
  float fVar217;
  float fVar228;
  float fVar229;
  vint4 bi;
  undefined1 auVar218 [16];
  undefined1 auVar219 [16];
  undefined1 auVar220 [16];
  undefined1 auVar221 [16];
  undefined1 auVar222 [16];
  undefined1 auVar223 [16];
  float fVar230;
  float fVar231;
  float fVar232;
  float fVar233;
  undefined1 auVar224 [32];
  undefined1 auVar225 [32];
  undefined1 auVar226 [32];
  undefined1 auVar227 [32];
  undefined1 auVar234 [16];
  float fVar235;
  undefined1 auVar238 [16];
  float fVar244;
  float fVar245;
  undefined1 auVar236 [16];
  undefined1 auVar237 [16];
  undefined1 auVar239 [16];
  float fVar246;
  undefined1 auVar240 [32];
  undefined1 auVar241 [32];
  undefined1 auVar242 [32];
  float fVar247;
  float fVar248;
  undefined1 auVar243 [64];
  float fVar249;
  float fVar262;
  float fVar263;
  vint4 ai_1;
  undefined1 auVar250 [16];
  undefined1 auVar251 [16];
  float fVar264;
  undefined1 auVar252 [32];
  undefined1 auVar253 [32];
  undefined1 auVar254 [32];
  undefined1 auVar255 [32];
  undefined1 auVar256 [32];
  undefined1 auVar257 [32];
  undefined1 auVar258 [32];
  undefined1 auVar259 [32];
  undefined1 auVar260 [32];
  undefined1 auVar261 [64];
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [64];
  undefined1 auVar268 [16];
  undefined1 auVar269 [16];
  undefined1 auVar270 [16];
  undefined1 auVar271 [16];
  undefined1 auVar273 [16];
  undefined1 auVar274 [16];
  undefined1 auVar275 [32];
  float fVar282;
  undefined1 auVar277 [16];
  float fVar283;
  float fVar284;
  float fVar285;
  float fVar286;
  undefined1 auVar278 [32];
  undefined1 auVar279 [32];
  undefined1 auVar280 [32];
  float s;
  undefined1 auVar287 [32];
  undefined1 auVar288 [32];
  undefined1 auVar289 [32];
  undefined1 auVar290 [32];
  float fVar292;
  undefined1 auVar291 [64];
  undefined1 auVar293 [16];
  undefined1 auVar294 [16];
  undefined1 auVar295 [32];
  float fVar296;
  float fVar298;
  float fVar299;
  float fVar300;
  float fVar301;
  float fVar302;
  float fVar303;
  undefined1 auVar297 [32];
  RTCFilterFunctionNArguments args;
  Vec3fa dir;
  BBox<embree::vfloat_impl<8>_> tp0;
  BBox<embree::vfloat_impl<8>_> tp1;
  StackEntry stack [3];
  int local_ca8;
  float local_bc0;
  float fStack_b7c;
  float fStack_b78;
  float fStack_b74;
  uint uStack_b24;
  undefined4 local_b00;
  RTCFilterFunctionNArguments local_a90;
  undefined1 local_a60 [8];
  float fStack_a58;
  float fStack_a54;
  float fStack_a50;
  float fStack_a4c;
  float fStack_a48;
  undefined1 local_a40 [32];
  undefined1 local_a20 [32];
  undefined1 local_a00 [32];
  undefined1 local_9e0 [16];
  undefined1 local_9d0 [16];
  undefined1 local_9c0 [32];
  undefined1 local_9a0 [32];
  undefined1 local_980 [8];
  float fStack_978;
  float fStack_974;
  float fStack_970;
  float fStack_96c;
  float fStack_968;
  float fStack_964;
  undefined1 local_960 [8];
  float fStack_958;
  float fStack_954;
  undefined1 auStack_950 [16];
  undefined1 local_940 [32];
  undefined1 local_920 [16];
  Primitive *local_910;
  ulong local_908;
  undefined1 local_900 [32];
  undefined1 local_8e0 [32];
  undefined4 local_8c0;
  undefined4 uStack_8bc;
  undefined4 uStack_8b8;
  undefined4 uStack_8b4;
  undefined4 uStack_8b0;
  undefined4 uStack_8ac;
  undefined4 uStack_8a8;
  undefined4 uStack_8a4;
  undefined1 local_8a0 [8];
  float fStack_898;
  float fStack_894;
  float fStack_890;
  float fStack_88c;
  float fStack_888;
  float fStack_884;
  undefined1 local_880 [8];
  float fStack_878;
  float fStack_874;
  float fStack_870;
  float fStack_86c;
  float fStack_868;
  undefined1 local_860 [32];
  undefined1 local_840 [32];
  undefined1 local_820 [8];
  float fStack_818;
  float fStack_814;
  float fStack_810;
  float fStack_80c;
  float fStack_808;
  undefined1 local_800 [32];
  undefined1 local_7e0 [32];
  undefined1 local_7c0 [32];
  undefined1 local_7a0 [32];
  undefined1 local_780 [32];
  undefined1 local_760 [32];
  undefined1 local_740 [32];
  undefined1 local_720 [32];
  undefined1 local_6f0 [16];
  undefined1 local_6e0 [16];
  undefined1 local_6d0 [16];
  undefined1 local_6c0 [32];
  undefined1 local_6a0 [32];
  uint local_680;
  uint uStack_67c;
  uint uStack_678;
  uint uStack_674;
  uint uStack_670;
  uint uStack_66c;
  uint uStack_668;
  uint uStack_664;
  uint local_660;
  uint uStack_65c;
  uint uStack_658;
  uint uStack_654;
  uint uStack_650;
  uint uStack_64c;
  uint uStack_648;
  uint uStack_644;
  undefined1 local_640 [32];
  undefined4 local_620;
  undefined4 uStack_61c;
  undefined4 uStack_618;
  undefined4 uStack_614;
  undefined4 uStack_610;
  undefined4 uStack_60c;
  undefined4 uStack_608;
  undefined4 uStack_604;
  undefined4 local_600;
  undefined4 uStack_5fc;
  undefined4 uStack_5f8;
  undefined4 uStack_5f4;
  undefined4 uStack_5f0;
  undefined4 uStack_5ec;
  undefined4 uStack_5e8;
  undefined4 uStack_5e4;
  undefined4 local_5e0;
  undefined4 uStack_5dc;
  undefined4 uStack_5d8;
  undefined4 uStack_5d4;
  undefined4 uStack_5d0;
  undefined4 uStack_5cc;
  undefined4 uStack_5c8;
  undefined4 uStack_5c4;
  undefined8 local_5c0;
  undefined8 uStack_5b8;
  undefined8 uStack_5b0;
  undefined8 uStack_5a8;
  undefined8 local_5a0;
  undefined8 uStack_598;
  undefined8 uStack_590;
  undefined8 uStack_588;
  undefined8 local_580;
  undefined8 uStack_578;
  undefined8 uStack_570;
  undefined8 uStack_568;
  undefined8 local_560;
  undefined8 uStack_558;
  undefined8 uStack_550;
  undefined8 uStack_548;
  undefined8 local_540;
  undefined8 uStack_538;
  undefined8 uStack_530;
  undefined8 uStack_528;
  undefined8 local_520;
  undefined8 uStack_518;
  undefined8 uStack_510;
  undefined8 uStack_508;
  undefined8 local_500;
  undefined8 uStack_4f8;
  undefined8 uStack_4f0;
  undefined8 uStack_4e8;
  undefined8 local_4e0;
  undefined8 uStack_4d8;
  undefined8 uStack_4d0;
  undefined8 uStack_4c8;
  undefined8 local_4c0;
  undefined8 uStack_4b8;
  undefined8 uStack_4b0;
  undefined8 uStack_4a8;
  undefined8 local_4a0;
  undefined8 uStack_498;
  undefined8 uStack_490;
  undefined8 uStack_488;
  undefined1 local_480 [32];
  undefined1 local_460 [32];
  undefined1 local_440 [32];
  undefined8 local_420;
  undefined8 uStack_418;
  undefined8 uStack_410;
  undefined8 uStack_408;
  undefined4 local_400;
  undefined4 uStack_3fc;
  undefined4 uStack_3f8;
  undefined4 uStack_3f4;
  undefined4 uStack_3f0;
  undefined4 uStack_3ec;
  undefined4 uStack_3e8;
  undefined4 uStack_3e4;
  undefined8 local_3e0;
  undefined8 uStack_3d8;
  undefined8 uStack_3d0;
  undefined8 uStack_3c8;
  undefined1 local_3c0 [32];
  undefined8 local_3a0;
  undefined8 uStack_398;
  undefined8 uStack_390;
  undefined8 uStack_388;
  undefined1 local_380 [32];
  uint local_360;
  uint uStack_35c;
  uint uStack_358;
  uint uStack_354;
  uint uStack_350;
  uint uStack_34c;
  uint uStack_348;
  uint uStack_344;
  uint local_340;
  uint uStack_33c;
  uint uStack_338;
  uint uStack_334;
  uint uStack_330;
  uint uStack_32c;
  uint uStack_328;
  uint uStack_324;
  undefined1 local_320 [32];
  undefined1 local_300 [32];
  float local_2e0;
  float fStack_2dc;
  float fStack_2d8;
  float fStack_2d4;
  undefined4 uStack_2d0;
  undefined4 uStack_2cc;
  undefined4 uStack_2c8;
  undefined4 uStack_2c4;
  undefined1 local_2c0 [32];
  float local_2a0;
  float fStack_29c;
  float fStack_298;
  float fStack_294;
  undefined4 uStack_290;
  undefined4 uStack_28c;
  undefined4 uStack_288;
  undefined4 uStack_284;
  float local_280;
  float fStack_27c;
  float fStack_278;
  float fStack_274;
  float fStack_270;
  float fStack_26c;
  float fStack_268;
  float fStack_264;
  float local_260;
  float fStack_25c;
  float fStack_258;
  float fStack_254;
  float fStack_250;
  float fStack_24c;
  float fStack_248;
  float fStack_244;
  undefined1 local_240 [32];
  undefined1 local_220 [32];
  undefined8 local_200;
  undefined8 uStack_1f8;
  undefined8 uStack_1f0;
  undefined8 uStack_1e8;
  undefined8 local_1e0;
  undefined8 uStack_1d8;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined1 local_1c0 [32];
  undefined1 local_1a0 [32];
  undefined1 auStack_180 [32];
  undefined1 auStack_160 [32];
  undefined8 uStack_140;
  int aiStack_138 [66];
  undefined1 auVar272 [32];
  undefined1 auVar276 [64];
  undefined1 auVar281 [64];
  
  PVar2 = prim[1];
  uVar93 = (ulong)(byte)PVar2;
  fVar98 = *(float *)(prim + uVar93 * 0x19 + 0x12);
  auVar5 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x10
                        );
  auVar5 = vinsertps_avx(auVar5,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x20);
  auVar6 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4 + 0x80)),
                         ZEXT416(*(uint *)(ray + k * 4 + 0xa0)),0x10);
  auVar6 = vinsertps_avx(auVar6,ZEXT416(*(uint *)(ray + k * 4 + 0xc0)),0x20);
  auVar5 = vsubps_avx(auVar5,*(undefined1 (*) [16])(prim + uVar93 * 0x19 + 6));
  auVar101._0_4_ = fVar98 * auVar5._0_4_;
  auVar101._4_4_ = fVar98 * auVar5._4_4_;
  auVar101._8_4_ = fVar98 * auVar5._8_4_;
  auVar101._12_4_ = fVar98 * auVar5._12_4_;
  auVar218._0_4_ = fVar98 * auVar6._0_4_;
  auVar218._4_4_ = fVar98 * auVar6._4_4_;
  auVar218._8_4_ = fVar98 * auVar6._8_4_;
  auVar218._12_4_ = fVar98 * auVar6._12_4_;
  auVar5 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 4 + 6)));
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar6 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 5 + 6)));
  auVar6 = vcvtdq2ps_avx(auVar6);
  auVar7 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 6 + 6)));
  auVar7 = vcvtdq2ps_avx(auVar7);
  auVar8 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar93 * 0xb + 6)));
  auVar8 = vcvtdq2ps_avx(auVar8);
  auVar9 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (ulong)((uint)(byte)PVar2 * 0xc) + 6)));
  auVar9 = vcvtdq2ps_avx(auVar9);
  auVar10 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + (uint)(byte)PVar2 * 0xc + uVar93 + 6)));
  auVar10 = vcvtdq2ps_avx(auVar10);
  uVar94 = (ulong)(uint)((int)(uVar93 * 9) * 2);
  auVar104 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 6)));
  auVar104 = vcvtdq2ps_avx(auVar104);
  auVar103 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + uVar93 + 6)));
  auVar103 = vcvtdq2ps_avx(auVar103);
  uVar94 = (ulong)(uint)((int)(uVar93 * 5) << 2);
  auVar160 = vpmovsxbd_avx(ZEXT416(*(uint *)(prim + uVar94 + 6)));
  auVar160 = vcvtdq2ps_avx(auVar160);
  auVar291 = ZEXT1664(auVar160);
  auVar293._4_4_ = auVar218._0_4_;
  auVar293._0_4_ = auVar218._0_4_;
  auVar293._8_4_ = auVar218._0_4_;
  auVar293._12_4_ = auVar218._0_4_;
  auVar137 = vshufps_avx(auVar218,auVar218,0x55);
  auVar102 = vshufps_avx(auVar218,auVar218,0xaa);
  fVar98 = auVar102._0_4_;
  auVar273._0_4_ = fVar98 * auVar7._0_4_;
  fVar134 = auVar102._4_4_;
  auVar273._4_4_ = fVar134 * auVar7._4_4_;
  fVar135 = auVar102._8_4_;
  auVar273._8_4_ = fVar135 * auVar7._8_4_;
  fVar203 = auVar102._12_4_;
  auVar273._12_4_ = fVar203 * auVar7._12_4_;
  auVar268._0_4_ = auVar10._0_4_ * fVar98;
  auVar268._4_4_ = auVar10._4_4_ * fVar134;
  auVar268._8_4_ = auVar10._8_4_ * fVar135;
  auVar268._12_4_ = auVar10._12_4_ * fVar203;
  auVar250._0_4_ = auVar160._0_4_ * fVar98;
  auVar250._4_4_ = auVar160._4_4_ * fVar134;
  auVar250._8_4_ = auVar160._8_4_ * fVar135;
  auVar250._12_4_ = auVar160._12_4_ * fVar203;
  auVar102 = vfmadd231ps_fma(auVar273,auVar137,auVar6);
  auVar138 = vfmadd231ps_fma(auVar268,auVar137,auVar9);
  auVar137 = vfmadd231ps_fma(auVar250,auVar103,auVar137);
  auVar112 = vfmadd231ps_fma(auVar102,auVar293,auVar5);
  auVar138 = vfmadd231ps_fma(auVar138,auVar293,auVar8);
  auVar107 = vfmadd231ps_fma(auVar137,auVar104,auVar293);
  auVar294._4_4_ = auVar101._0_4_;
  auVar294._0_4_ = auVar101._0_4_;
  auVar294._8_4_ = auVar101._0_4_;
  auVar294._12_4_ = auVar101._0_4_;
  auVar137 = vshufps_avx(auVar101,auVar101,0x55);
  auVar102 = vshufps_avx(auVar101,auVar101,0xaa);
  fVar98 = auVar102._0_4_;
  auVar219._0_4_ = fVar98 * auVar7._0_4_;
  fVar134 = auVar102._4_4_;
  auVar219._4_4_ = fVar134 * auVar7._4_4_;
  fVar135 = auVar102._8_4_;
  auVar219._8_4_ = fVar135 * auVar7._8_4_;
  fVar203 = auVar102._12_4_;
  auVar219._12_4_ = fVar203 * auVar7._12_4_;
  auVar136._0_4_ = auVar10._0_4_ * fVar98;
  auVar136._4_4_ = auVar10._4_4_ * fVar134;
  auVar136._8_4_ = auVar10._8_4_ * fVar135;
  auVar136._12_4_ = auVar10._12_4_ * fVar203;
  auVar102._0_4_ = auVar160._0_4_ * fVar98;
  auVar102._4_4_ = auVar160._4_4_ * fVar134;
  auVar102._8_4_ = auVar160._8_4_ * fVar135;
  auVar102._12_4_ = auVar160._12_4_ * fVar203;
  auVar6 = vfmadd231ps_fma(auVar219,auVar137,auVar6);
  auVar7 = vfmadd231ps_fma(auVar136,auVar137,auVar9);
  auVar9 = vfmadd231ps_fma(auVar102,auVar137,auVar103);
  auVar10 = vfmadd231ps_fma(auVar6,auVar294,auVar5);
  auVar103 = vfmadd231ps_fma(auVar7,auVar294,auVar8);
  auVar160 = vfmadd231ps_fma(auVar9,auVar294,auVar104);
  auVar236._8_4_ = 0x7fffffff;
  auVar236._0_8_ = 0x7fffffff7fffffff;
  auVar236._12_4_ = 0x7fffffff;
  auVar5 = vandps_avx(auVar112,auVar236);
  auVar204._8_4_ = 0x219392ef;
  auVar204._0_8_ = 0x219392ef219392ef;
  auVar204._12_4_ = 0x219392ef;
  auVar5 = vcmpps_avx(auVar5,auVar204,1);
  auVar6 = vblendvps_avx(auVar112,auVar204,auVar5);
  auVar5 = vandps_avx(auVar138,auVar236);
  auVar5 = vcmpps_avx(auVar5,auVar204,1);
  auVar7 = vblendvps_avx(auVar138,auVar204,auVar5);
  auVar5 = vandps_avx(auVar107,auVar236);
  auVar5 = vcmpps_avx(auVar5,auVar204,1);
  auVar5 = vblendvps_avx(auVar107,auVar204,auVar5);
  auVar8 = vrcpps_avx(auVar6);
  auVar237._8_4_ = 0x3f800000;
  auVar237._0_8_ = 0x3f8000003f800000;
  auVar237._12_4_ = 0x3f800000;
  auVar6 = vfnmadd213ps_fma(auVar6,auVar8,auVar237);
  auVar8 = vfmadd132ps_fma(auVar6,auVar8,auVar8);
  auVar6 = vrcpps_avx(auVar7);
  auVar7 = vfnmadd213ps_fma(auVar7,auVar6,auVar237);
  auVar9 = vfmadd132ps_fma(auVar7,auVar6,auVar6);
  auVar6 = vrcpps_avx(auVar5);
  auVar5 = vfnmadd213ps_fma(auVar5,auVar6,auVar237);
  auVar104 = vfmadd132ps_fma(auVar5,auVar6,auVar6);
  auVar5._8_8_ = 0;
  auVar5._0_8_ = *(ulong *)(prim + uVar93 * 7 + 6);
  auVar5 = vpmovsxwd_avx(auVar5);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar10);
  auVar107._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar107._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar107._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar107._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar6._8_8_ = 0;
  auVar6._0_8_ = *(ulong *)(prim + uVar93 * 9 + 6);
  auVar5 = vpmovsxwd_avx(auVar6);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar10);
  auVar220._0_4_ = auVar8._0_4_ * auVar5._0_4_;
  auVar220._4_4_ = auVar8._4_4_ * auVar5._4_4_;
  auVar220._8_4_ = auVar8._8_4_ * auVar5._8_4_;
  auVar220._12_4_ = auVar8._12_4_ * auVar5._12_4_;
  auVar138._1_3_ = 0;
  auVar138[0] = PVar2;
  auVar7._8_8_ = 0;
  auVar7._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + 6);
  auVar6 = vpmovsxwd_avx(auVar7);
  auVar8._8_8_ = 0;
  auVar8._0_8_ = *(ulong *)(prim + (ulong)(byte)PVar2 * 0x10 + uVar93 * -2 + 6);
  auVar5 = vpmovsxwd_avx(auVar8);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar103);
  auVar251._0_4_ = auVar5._0_4_ * auVar9._0_4_;
  auVar251._4_4_ = auVar5._4_4_ * auVar9._4_4_;
  auVar251._8_4_ = auVar5._8_4_ * auVar9._8_4_;
  auVar251._12_4_ = auVar5._12_4_ * auVar9._12_4_;
  auVar5 = vcvtdq2ps_avx(auVar6);
  auVar5 = vsubps_avx(auVar5,auVar103);
  auVar137._0_4_ = auVar9._0_4_ * auVar5._0_4_;
  auVar137._4_4_ = auVar9._4_4_ * auVar5._4_4_;
  auVar137._8_4_ = auVar9._8_4_ * auVar5._8_4_;
  auVar137._12_4_ = auVar9._12_4_ * auVar5._12_4_;
  auVar9._8_8_ = 0;
  auVar9._0_8_ = *(ulong *)(prim + uVar94 + uVar93 + 6);
  auVar5 = vpmovsxwd_avx(auVar9);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar160);
  auVar112._0_4_ = auVar104._0_4_ * auVar5._0_4_;
  auVar112._4_4_ = auVar104._4_4_ * auVar5._4_4_;
  auVar112._8_4_ = auVar104._8_4_ * auVar5._8_4_;
  auVar112._12_4_ = auVar104._12_4_ * auVar5._12_4_;
  auVar10._8_8_ = 0;
  auVar10._0_8_ = *(ulong *)(prim + uVar93 * 0x17 + 6);
  auVar5 = vpmovsxwd_avx(auVar10);
  auVar5 = vcvtdq2ps_avx(auVar5);
  auVar5 = vsubps_avx(auVar5,auVar160);
  auVar103._0_4_ = auVar104._0_4_ * auVar5._0_4_;
  auVar103._4_4_ = auVar104._4_4_ * auVar5._4_4_;
  auVar103._8_4_ = auVar104._8_4_ * auVar5._8_4_;
  auVar103._12_4_ = auVar104._12_4_ * auVar5._12_4_;
  auVar5 = vpminsd_avx(auVar107,auVar220);
  auVar6 = vpminsd_avx(auVar251,auVar137);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  auVar6 = vpminsd_avx(auVar112,auVar103);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x60);
  auVar265._4_4_ = uVar99;
  auVar265._0_4_ = uVar99;
  auVar265._8_4_ = uVar99;
  auVar265._12_4_ = uVar99;
  auVar6 = vmaxps_avx(auVar6,auVar265);
  auVar5 = vmaxps_avx(auVar5,auVar6);
  local_6e0._0_4_ = auVar5._0_4_ * 0.99999964;
  local_6e0._4_4_ = auVar5._4_4_ * 0.99999964;
  local_6e0._8_4_ = auVar5._8_4_ * 0.99999964;
  local_6e0._12_4_ = auVar5._12_4_ * 0.99999964;
  auVar5 = vpmaxsd_avx(auVar107,auVar220);
  auVar6 = vpmaxsd_avx(auVar251,auVar137);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar6 = vpmaxsd_avx(auVar112,auVar103);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar160._4_4_ = uVar99;
  auVar160._0_4_ = uVar99;
  auVar160._8_4_ = uVar99;
  auVar160._12_4_ = uVar99;
  auVar6 = vminps_avx(auVar6,auVar160);
  auVar5 = vminps_avx(auVar5,auVar6);
  auVar104._0_4_ = auVar5._0_4_ * 1.0000004;
  auVar104._4_4_ = auVar5._4_4_ * 1.0000004;
  auVar104._8_4_ = auVar5._8_4_ * 1.0000004;
  auVar104._12_4_ = auVar5._12_4_ * 1.0000004;
  auVar138[4] = PVar2;
  auVar138._5_3_ = 0;
  auVar138[8] = PVar2;
  auVar138._9_3_ = 0;
  auVar138[0xc] = PVar2;
  auVar138._13_3_ = 0;
  auVar6 = vpcmpgtd_avx(auVar138,_DAT_01f7fcf0);
  auVar5 = vcmpps_avx(local_6e0,auVar104,2);
  auVar5 = vandps_avx(auVar5,auVar6);
  uVar88 = vmovmskps_avx(auVar5);
  if (uVar88 == 0) {
    return false;
  }
  uVar88 = uVar88 & 0xff;
  auVar117._16_16_ = mm_lookupmask_ps._240_16_;
  auVar117._0_16_ = mm_lookupmask_ps._240_16_;
  local_800 = vblendps_avx(auVar117,ZEXT832(0) << 0x20,0x80);
  iVar89 = 1 << ((uint)k & 0x1f);
  auVar118._4_4_ = iVar89;
  auVar118._0_4_ = iVar89;
  auVar118._8_4_ = iVar89;
  auVar118._12_4_ = iVar89;
  auVar118._16_4_ = iVar89;
  auVar118._20_4_ = iVar89;
  auVar118._24_4_ = iVar89;
  auVar118._28_4_ = iVar89;
  auVar183 = vpmovzxbd_avx2(ZEXT816(0x8040201008040201));
  auVar117 = vpand_avx2(auVar118,auVar183);
  local_6c0 = vpcmpeqd_avx2(auVar117,auVar183);
  local_8c0 = 0x7fffffff;
  uStack_8bc = 0x7fffffff;
  uStack_8b8 = 0x7fffffff;
  uStack_8b4 = 0x7fffffff;
  uStack_8b0 = 0x7fffffff;
  uStack_8ac = 0x7fffffff;
  uStack_8a8 = 0x7fffffff;
  uStack_8a4 = 0x7fffffff;
  local_910 = prim;
LAB_016105dc:
  lVar21 = 0;
  local_908 = (ulong)uVar88;
  for (uVar94 = local_908; (uVar94 & 1) == 0; uVar94 = uVar94 >> 1 | 0x8000000000000000) {
    lVar21 = lVar21 + 1;
  }
  uVar88 = *(uint *)(local_910 + 2);
  local_680 = *(uint *)(local_910 + lVar21 * 4 + 6);
  pGVar3 = (context->scene->geometries).items[uVar88].ptr;
  uVar94 = (ulong)*(uint *)(*(long *)&pGVar3->field_0x58 +
                           pGVar3[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i * (ulong)local_680);
  p_Var4 = pGVar3[1].intersectionFilterN;
  lVar21 = *(long *)&pGVar3[1].time_range.upper;
  auVar5 = *(undefined1 (*) [16])(lVar21 + (long)p_Var4 * uVar94);
  auVar6 = *(undefined1 (*) [16])(lVar21 + (uVar94 + 1) * (long)p_Var4);
  local_908 = local_908 - 1 & local_908;
  if (local_908 != 0) {
    uVar95 = local_908 - 1 & local_908;
    for (uVar93 = local_908; (uVar93 & 1) == 0; uVar93 = uVar93 >> 1 | 0x8000000000000000) {
    }
    if (uVar95 != 0) {
      for (; (uVar95 & 1) == 0; uVar95 = uVar95 >> 1 | 0x8000000000000000) {
      }
    }
  }
  auVar7 = vinsertps_avx(ZEXT416(*(uint *)(ray + k * 4)),ZEXT416(*(uint *)(ray + k * 4 + 0x20)),0x1c
                        );
  auVar8 = vinsertps_avx(auVar7,ZEXT416(*(uint *)(ray + k * 4 + 0x40)),0x28);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x80);
  auVar274._4_4_ = uVar99;
  auVar274._0_4_ = uVar99;
  auVar274._8_4_ = uVar99;
  auVar274._12_4_ = uVar99;
  fStack_870 = (float)uVar99;
  _local_880 = auVar274;
  fStack_86c = (float)uVar99;
  fStack_868 = (float)uVar99;
  register0x000014dc = uVar99;
  auVar276 = ZEXT3264(_local_880);
  uVar99 = *(undefined4 *)(ray + k * 4 + 0xa0);
  auVar277._4_4_ = uVar99;
  auVar277._0_4_ = uVar99;
  auVar277._8_4_ = uVar99;
  auVar277._12_4_ = uVar99;
  fStack_a50 = (float)uVar99;
  _local_a60 = auVar277;
  fStack_a4c = (float)uVar99;
  fStack_a48 = (float)uVar99;
  register0x0000151c = uVar99;
  auVar281 = ZEXT3264(_local_a60);
  auVar7 = vunpcklps_avx(auVar274,auVar277);
  fVar98 = *(float *)(ray + k * 4 + 0xc0);
  auVar269._4_4_ = fVar98;
  auVar269._0_4_ = fVar98;
  auVar269._8_4_ = fVar98;
  auVar269._12_4_ = fVar98;
  auVar272._16_4_ = fVar98;
  auVar272._0_16_ = auVar269;
  auVar272._20_4_ = fVar98;
  auVar272._24_4_ = fVar98;
  auVar272._28_4_ = fVar98;
  local_9d0 = vinsertps_avx(auVar7,auVar269,0x28);
  auVar261 = ZEXT1664(local_9d0);
  auVar221._0_4_ = (auVar5._0_4_ + auVar6._0_4_) * 0.5;
  auVar221._4_4_ = (auVar5._4_4_ + auVar6._4_4_) * 0.5;
  auVar221._8_4_ = (auVar5._8_4_ + auVar6._8_4_) * 0.5;
  auVar221._12_4_ = (auVar5._12_4_ + auVar6._12_4_) * 0.5;
  auVar7 = vsubps_avx(auVar221,auVar8);
  auVar7 = vdpps_avx(auVar7,local_9d0,0x7f);
  local_9e0 = vdpps_avx(local_9d0,local_9d0,0x7f);
  auVar267 = ZEXT1664(local_9e0);
  auVar9 = vrcpss_avx(local_9e0,local_9e0);
  auVar10 = vfnmadd213ss_fma(auVar9,local_9e0,ZEXT416(0x40000000));
  local_280 = auVar7._0_4_ * auVar9._0_4_ * auVar10._0_4_;
  auVar234._4_4_ = local_280;
  auVar234._0_4_ = local_280;
  auVar234._8_4_ = local_280;
  auVar234._12_4_ = local_280;
  fStack_970 = local_280;
  _local_980 = auVar234;
  fStack_96c = local_280;
  fStack_968 = local_280;
  fStack_964 = local_280;
  auVar7 = vfmadd231ps_fma(auVar8,local_9d0,auVar234);
  auVar7 = vblendps_avx(auVar7,_DAT_01f7aa10,8);
  auVar8 = vsubps_avx(auVar5,auVar7);
  auVar9 = vsubps_avx(*(undefined1 (*) [16])(lVar21 + (uVar94 + 2) * (long)p_Var4),auVar7);
  auVar10 = vsubps_avx(auVar6,auVar7);
  auVar7 = vsubps_avx(*(undefined1 (*) [16])(lVar21 + (uVar94 + 3) * (long)p_Var4),auVar7);
  auVar5 = vmovshdup_avx(auVar8);
  local_1e0 = auVar5._0_8_;
  uStack_1d8 = local_1e0;
  uStack_1d0 = local_1e0;
  uStack_1c8 = local_1e0;
  auVar5 = vshufps_avx(auVar8,auVar8,0xaa);
  local_4a0 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar8,auVar8,0xff);
  local_200 = auVar5._0_8_;
  uStack_1f8 = local_200;
  uStack_1f0 = local_200;
  uStack_1e8 = local_200;
  auVar5 = vmovshdup_avx(auVar10);
  local_4c0 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar10,auVar10,0xaa);
  local_4e0 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar10,auVar10,0xff);
  local_500 = auVar5._0_8_;
  auVar5 = vmovshdup_avx(auVar9);
  local_520 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar9,auVar9,0xaa);
  local_540 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar9,auVar9,0xff);
  local_560 = auVar5._0_8_;
  auVar5 = vmovshdup_avx(auVar7);
  local_580 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar7,auVar7,0xaa);
  local_5a0 = auVar5._0_8_;
  auVar5 = vshufps_avx(auVar7,auVar7,0xff);
  local_5c0 = auVar5._0_8_;
  auVar5 = vfmadd231ps_fma(ZEXT432((uint)(fVar98 * fVar98)),_local_a60,_local_a60);
  auVar5 = vfmadd231ps_fma(ZEXT1632(auVar5),_local_880,_local_880);
  uVar99 = auVar5._0_4_;
  local_220._4_4_ = uVar99;
  local_220._0_4_ = uVar99;
  local_220._8_4_ = uVar99;
  local_220._12_4_ = uVar99;
  local_220._16_4_ = uVar99;
  local_220._20_4_ = uVar99;
  local_220._24_4_ = uVar99;
  local_220._28_4_ = uVar99;
  auVar243 = ZEXT3264(local_220);
  fVar134 = *(float *)(ray + k * 4 + 0x60);
  local_920 = ZEXT416((uint)local_280);
  local_280 = fVar134 - local_280;
  fStack_27c = local_280;
  fStack_278 = local_280;
  fStack_274 = local_280;
  fStack_270 = local_280;
  fStack_26c = local_280;
  fStack_268 = local_280;
  fStack_264 = local_280;
  local_ca8 = 1;
  uVar94 = 0;
  bVar96 = false;
  local_5e0 = auVar8._0_4_;
  local_600 = auVar10._0_4_;
  local_620 = auVar9._0_4_;
  fVar135 = auVar7._0_4_;
  auVar183._4_4_ = uStack_8bc;
  auVar183._0_4_ = local_8c0;
  auVar183._8_4_ = uStack_8b8;
  auVar183._12_4_ = uStack_8b4;
  auVar183._16_4_ = uStack_8b0;
  auVar183._20_4_ = uStack_8ac;
  auVar183._24_4_ = uStack_8a8;
  auVar183._28_4_ = uStack_8a4;
  local_640 = vandps_avx(local_220,auVar183);
  auVar5 = vsqrtss_avx(local_9e0,local_9e0);
  auVar6 = vsqrtss_avx(local_9e0,local_9e0);
  local_6d0 = ZEXT816(0x3f80000000000000);
  local_260 = fVar135;
  fStack_25c = fVar135;
  fStack_258 = fVar135;
  fStack_254 = fVar135;
  fStack_250 = fVar135;
  fStack_24c = fVar135;
  fStack_248 = fVar135;
  fStack_244 = fVar135;
  uStack_67c = local_680;
  uStack_678 = local_680;
  uStack_674 = local_680;
  uStack_670 = local_680;
  uStack_66c = local_680;
  uStack_668 = local_680;
  uStack_664 = local_680;
  local_660 = uVar88;
  uStack_65c = uVar88;
  uStack_658 = uVar88;
  uStack_654 = uVar88;
  uStack_650 = uVar88;
  uStack_64c = uVar88;
  uStack_648 = uVar88;
  uStack_644 = uVar88;
  uStack_61c = local_620;
  uStack_618 = local_620;
  uStack_614 = local_620;
  uStack_610 = local_620;
  uStack_60c = local_620;
  uStack_608 = local_620;
  uStack_604 = local_620;
  uStack_5fc = local_600;
  uStack_5f8 = local_600;
  uStack_5f4 = local_600;
  uStack_5f0 = local_600;
  uStack_5ec = local_600;
  uStack_5e8 = local_600;
  uStack_5e4 = local_600;
  uStack_5dc = local_5e0;
  uStack_5d8 = local_5e0;
  uStack_5d4 = local_5e0;
  uStack_5d0 = local_5e0;
  uStack_5cc = local_5e0;
  uStack_5c8 = local_5e0;
  uStack_5c4 = local_5e0;
  uStack_5b8 = local_5c0;
  uStack_5b0 = local_5c0;
  uStack_5a8 = local_5c0;
  uStack_598 = local_5a0;
  uStack_590 = local_5a0;
  uStack_588 = local_5a0;
  uStack_578 = local_580;
  uStack_570 = local_580;
  uStack_568 = local_580;
  uStack_558 = local_560;
  uStack_550 = local_560;
  uStack_548 = local_560;
  uStack_538 = local_540;
  uStack_530 = local_540;
  uStack_528 = local_540;
  uStack_518 = local_520;
  uStack_510 = local_520;
  uStack_508 = local_520;
  uStack_4f8 = local_500;
  uStack_4f0 = local_500;
  uStack_4e8 = local_500;
  uStack_4d8 = local_4e0;
  uStack_4d0 = local_4e0;
  uStack_4c8 = local_4e0;
  uStack_4b8 = local_4c0;
  uStack_4b0 = local_4c0;
  uStack_4a8 = local_4c0;
  uStack_498 = local_4a0;
  uStack_490 = local_4a0;
  uStack_488 = local_4a0;
  do {
    iVar89 = (int)uVar94;
    auVar104 = vmovshdup_avx(local_6d0);
    auVar104 = vsubps_avx(auVar104,local_6d0);
    local_9a0._0_4_ = auVar104._0_4_;
    fVar203 = (float)local_9a0._0_4_ * 0.04761905;
    uVar99 = local_6d0._0_4_;
    local_a40._4_4_ = uVar99;
    local_a40._0_4_ = uVar99;
    local_a40._8_4_ = uVar99;
    local_a40._12_4_ = uVar99;
    local_a40._16_4_ = uVar99;
    local_a40._20_4_ = uVar99;
    local_a40._24_4_ = uVar99;
    local_a40._28_4_ = uVar99;
    local_9a0._4_4_ = local_9a0._0_4_;
    local_9a0._8_4_ = local_9a0._0_4_;
    local_9a0._12_4_ = local_9a0._0_4_;
    local_9a0._16_4_ = local_9a0._0_4_;
    local_9a0._20_4_ = local_9a0._0_4_;
    local_9a0._24_4_ = local_9a0._0_4_;
    local_9a0._28_4_ = local_9a0._0_4_;
    auVar104 = vfmadd231ps_fma(local_a40,local_9a0,_DAT_01faff20);
    auVar119._8_4_ = 0x3f800000;
    auVar119._0_8_ = 0x3f8000003f800000;
    auVar119._12_4_ = 0x3f800000;
    auVar119._16_4_ = 0x3f800000;
    auVar119._20_4_ = 0x3f800000;
    auVar119._24_4_ = 0x3f800000;
    auVar119._28_4_ = 0x3f800000;
    auVar117 = vsubps_avx(auVar119,ZEXT1632(auVar104));
    fVar214 = auVar104._0_4_;
    fVar292 = auVar104._4_4_;
    fVar215 = auVar104._8_4_;
    fVar216 = auVar104._12_4_;
    fVar100 = auVar117._0_4_;
    fVar235 = auVar117._4_4_;
    fVar244 = auVar117._8_4_;
    fVar245 = auVar117._12_4_;
    fVar246 = auVar117._16_4_;
    fVar247 = auVar117._20_4_;
    fVar248 = auVar117._24_4_;
    auVar243._0_28_ =
         ZEXT1628(CONCAT412(fVar216 * fVar216,
                            CONCAT48(fVar215 * fVar215,CONCAT44(fVar292 * fVar292,fVar214 * fVar214)
                                    )));
    fVar249 = fVar214 * 3.0;
    fVar262 = fVar292 * 3.0;
    fVar263 = fVar215 * 3.0;
    fVar264 = fVar216 * 3.0;
    auVar158._0_4_ = fVar100 * fVar100;
    auVar158._4_4_ = fVar235 * fVar235;
    auVar158._8_4_ = fVar244 * fVar244;
    auVar158._12_4_ = fVar245 * fVar245;
    auVar158._16_4_ = fVar246 * fVar246;
    auVar158._20_4_ = fVar247 * fVar247;
    auVar158._28_36_ = auVar276._28_36_;
    auVar158._24_4_ = fVar248 * fVar248;
    auVar276._0_4_ = (auVar158._0_4_ * (fVar100 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar276._4_4_ = (auVar158._4_4_ * (fVar235 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar276._8_4_ = (auVar158._8_4_ * (fVar244 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar276._12_4_ = (auVar158._12_4_ * (fVar245 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar276._16_4_ = (auVar158._16_4_ * (fVar246 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar276._20_4_ = (auVar158._20_4_ * (fVar247 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar276._28_36_ = auVar291._28_36_;
    auVar276._24_4_ = (auVar158._24_4_ * (fVar248 * 3.0 + -5.0) + 2.0) * 0.5;
    auVar183 = auVar276._0_32_;
    fVar217 = fVar214 * fVar214 * -fVar100 * 0.5;
    fVar228 = fVar292 * fVar292 * -fVar235 * 0.5;
    fVar229 = fVar215 * fVar215 * -fVar244 * 0.5;
    fVar230 = fVar216 * fVar216 * -fVar245 * 0.5;
    fVar231 = -fVar246 * 0.0 * 0.0 * 0.5;
    fVar232 = -fVar247 * 0.0 * 0.0 * 0.5;
    fVar233 = -fVar248 * 0.0 * 0.0 * 0.5;
    auVar173._0_4_ = local_260 * fVar217;
    auVar173._4_4_ = fStack_25c * fVar228;
    auVar173._8_4_ = fStack_258 * fVar229;
    auVar173._12_4_ = fStack_254 * fVar230;
    auVar173._16_4_ = fStack_250 * fVar231;
    auVar173._20_4_ = fStack_24c * fVar232;
    auVar173._24_4_ = fStack_248 * fVar233;
    auVar173._28_4_ = 0;
    auVar12._4_4_ = fVar228 * local_580._4_4_;
    auVar12._0_4_ = fVar217 * (float)local_580;
    auVar12._8_4_ = fVar229 * (float)uStack_578;
    auVar12._12_4_ = fVar230 * uStack_578._4_4_;
    auVar12._16_4_ = fVar231 * (float)uStack_570;
    auVar12._20_4_ = fVar232 * uStack_570._4_4_;
    auVar12._24_4_ = fVar233 * (float)uStack_568;
    auVar12._28_4_ = auVar117._28_4_ ^ 0x80000000;
    auVar14._4_4_ = fVar228 * local_5a0._4_4_;
    auVar14._0_4_ = fVar217 * (float)local_5a0;
    auVar14._8_4_ = fVar229 * (float)uStack_598;
    auVar14._12_4_ = fVar230 * uStack_598._4_4_;
    auVar14._16_4_ = fVar231 * (float)uStack_590;
    auVar14._20_4_ = fVar232 * uStack_590._4_4_;
    auVar14._24_4_ = fVar233 * (float)uStack_588;
    auVar14._28_4_ = 0x40000000;
    auVar15._4_4_ = fVar228 * local_5c0._4_4_;
    auVar15._0_4_ = fVar217 * (float)local_5c0;
    auVar15._8_4_ = fVar229 * (float)uStack_5b8;
    auVar15._12_4_ = fVar230 * uStack_5b8._4_4_;
    auVar15._16_4_ = fVar231 * (float)uStack_5b0;
    auVar15._20_4_ = fVar232 * uStack_5b0._4_4_;
    auVar15._24_4_ = fVar233 * (float)uStack_5a8;
    auVar15._28_4_ = 0x80000000;
    auVar147._4_4_ = uStack_61c;
    auVar147._0_4_ = local_620;
    auVar147._8_4_ = uStack_618;
    auVar147._12_4_ = uStack_614;
    auVar147._16_4_ = uStack_610;
    auVar147._20_4_ = uStack_60c;
    auVar147._24_4_ = uStack_608;
    auVar147._28_4_ = uStack_604;
    auVar104 = vfmadd231ps_fma(auVar173,auVar183,auVar147);
    auVar72._8_8_ = uStack_518;
    auVar72._0_8_ = local_520;
    auVar72._16_8_ = uStack_510;
    auVar72._24_8_ = uStack_508;
    auVar103 = vfmadd231ps_fma(auVar12,auVar183,auVar72);
    auVar70._8_8_ = uStack_538;
    auVar70._0_8_ = local_540;
    auVar70._16_8_ = uStack_530;
    auVar70._24_8_ = uStack_528;
    auVar160 = vfmadd231ps_fma(auVar14,auVar183,auVar70);
    auVar68._8_8_ = uStack_558;
    auVar68._0_8_ = local_560;
    auVar68._16_8_ = uStack_550;
    auVar68._24_8_ = uStack_548;
    auVar137 = vfmadd231ps_fma(auVar15,auVar183,auVar68);
    auVar121._4_4_ = fVar235 * fVar235 * -fVar292 * 0.5;
    auVar121._0_4_ = fVar100 * fVar100 * -fVar214 * 0.5;
    auVar121._8_4_ = fVar244 * fVar244 * -fVar215 * 0.5;
    auVar121._12_4_ = fVar245 * fVar245 * -fVar216 * 0.5;
    auVar121._16_4_ = fVar246 * fVar246 * -0.0 * 0.5;
    auVar121._20_4_ = fVar247 * fVar247 * -0.0 * 0.5;
    auVar121._24_4_ = fVar248 * fVar248 * -0.0 * 0.5;
    auVar121._28_4_ = auVar281._28_4_;
    auVar126._4_4_ = ((fVar262 + -5.0) * fVar292 * fVar292 + 2.0) * 0.5;
    auVar126._0_4_ = ((fVar249 + -5.0) * fVar214 * fVar214 + 2.0) * 0.5;
    auVar126._8_4_ = ((fVar263 + -5.0) * fVar215 * fVar215 + 2.0) * 0.5;
    auVar126._12_4_ = ((fVar264 + -5.0) * fVar216 * fVar216 + 2.0) * 0.5;
    auVar126._16_4_ = 0x3f800000;
    auVar126._20_4_ = 0x3f800000;
    auVar126._24_4_ = 0x3f800000;
    auVar126._28_4_ = auVar291._28_4_ + 2.0;
    auVar64._4_4_ = uStack_5fc;
    auVar64._0_4_ = local_600;
    auVar64._8_4_ = uStack_5f8;
    auVar64._12_4_ = uStack_5f4;
    auVar64._16_4_ = uStack_5f0;
    auVar64._20_4_ = uStack_5ec;
    auVar64._24_4_ = uStack_5e8;
    auVar64._28_4_ = uStack_5e4;
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar126,auVar64);
    auVar78._8_8_ = uStack_4b8;
    auVar78._0_8_ = local_4c0;
    auVar78._16_8_ = uStack_4b0;
    auVar78._24_8_ = uStack_4a8;
    auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar126,auVar78);
    auVar76._8_8_ = uStack_4d8;
    auVar76._0_8_ = local_4e0;
    auVar76._16_8_ = uStack_4d0;
    auVar76._24_8_ = uStack_4c8;
    auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar126,auVar76);
    auVar74._8_8_ = uStack_4f8;
    auVar74._0_8_ = local_500;
    auVar74._16_8_ = uStack_4f0;
    auVar74._24_8_ = uStack_4e8;
    auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar126,auVar74);
    auVar66._4_4_ = uStack_5dc;
    auVar66._0_4_ = local_5e0;
    auVar66._8_4_ = uStack_5d8;
    auVar66._12_4_ = uStack_5d4;
    auVar66._16_4_ = uStack_5d0;
    auVar66._20_4_ = uStack_5cc;
    auVar66._24_4_ = uStack_5c8;
    auVar66._28_4_ = uStack_5c4;
    auVar104 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar121,auVar66);
    auVar86._8_8_ = uStack_1d8;
    auVar86._0_8_ = local_1e0;
    auVar86._16_8_ = uStack_1d0;
    auVar86._24_8_ = uStack_1c8;
    auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar121,auVar86);
    auVar147 = ZEXT1632(auVar103);
    auVar80._8_8_ = uStack_498;
    auVar80._0_8_ = local_4a0;
    auVar80._16_8_ = uStack_490;
    auVar80._24_8_ = uStack_488;
    auVar103 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar121,auVar80);
    auVar85._8_8_ = uStack_1f8;
    auVar85._0_8_ = local_200;
    auVar85._16_8_ = uStack_1f0;
    auVar85._24_8_ = uStack_1e8;
    auVar160 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar85,auVar121);
    auVar16._4_4_ = (fVar235 + fVar235) * fVar292;
    auVar16._0_4_ = (fVar100 + fVar100) * fVar214;
    auVar16._8_4_ = (fVar244 + fVar244) * fVar215;
    auVar16._12_4_ = (fVar245 + fVar245) * fVar216;
    auVar16._16_4_ = (fVar246 + fVar246) * 0.0;
    auVar16._20_4_ = (fVar247 + fVar247) * 0.0;
    auVar16._24_4_ = (fVar248 + fVar248) * 0.0;
    auVar16._28_4_ = 0;
    auVar183 = vsubps_avx(auVar16,auVar158._0_32_);
    fVar217 = auVar261._28_4_ + 2.0;
    auVar150._4_4_ = (fVar235 + fVar235) * (fVar262 + 2.0);
    auVar150._0_4_ = (fVar100 + fVar100) * (fVar249 + 2.0);
    auVar150._8_4_ = (fVar244 + fVar244) * (fVar263 + 2.0);
    auVar150._12_4_ = (fVar245 + fVar245) * (fVar264 + 2.0);
    auVar150._16_4_ = (fVar246 + fVar246) * 2.0;
    auVar150._20_4_ = (fVar247 + fVar247) * 2.0;
    auVar150._24_4_ = (fVar248 + fVar248) * 2.0;
    auVar150._28_4_ = fVar217;
    auVar212._4_4_ = fVar235 * 3.0 * fVar235;
    auVar212._0_4_ = fVar100 * 3.0 * fVar100;
    auVar212._8_4_ = fVar244 * 3.0 * fVar244;
    auVar212._12_4_ = fVar245 * 3.0 * fVar245;
    auVar212._16_4_ = fVar246 * 3.0 * fVar246;
    auVar212._20_4_ = fVar247 * 3.0 * fVar247;
    auVar212._24_4_ = fVar248 * 3.0 * fVar248;
    auVar212._28_4_ = auVar117._28_4_;
    auVar117 = vsubps_avx(auVar150,auVar212);
    auVar118 = vsubps_avx(auVar243._0_32_,auVar16);
    auVar17._4_4_ = auVar183._4_4_ * 0.5;
    auVar17._0_4_ = auVar183._0_4_ * 0.5;
    auVar17._8_4_ = auVar183._8_4_ * 0.5;
    auVar17._12_4_ = auVar183._12_4_ * 0.5;
    auVar17._16_4_ = auVar183._16_4_ * 0.5;
    auVar17._20_4_ = auVar183._20_4_ * 0.5;
    auVar17._24_4_ = auVar183._24_4_ * 0.5;
    auVar17._28_4_ = fVar217;
    auVar18._28_4_ = auVar261._28_4_ + -5.0 + 0.0;
    auVar18._0_28_ =
         ZEXT1628(CONCAT412(((fVar216 + fVar216) * (fVar264 + -5.0) + fVar264 * fVar216) * 0.5,
                            CONCAT48(((fVar215 + fVar215) * (fVar263 + -5.0) + fVar263 * fVar215) *
                                     0.5,CONCAT44(((fVar292 + fVar292) * (fVar262 + -5.0) +
                                                  fVar262 * fVar292) * 0.5,
                                                  ((fVar214 + fVar214) * (fVar249 + -5.0) +
                                                  fVar249 * fVar214) * 0.5))));
    auVar19._4_4_ = auVar117._4_4_ * 0.5;
    auVar19._0_4_ = auVar117._0_4_ * 0.5;
    auVar19._8_4_ = auVar117._8_4_ * 0.5;
    auVar19._12_4_ = auVar117._12_4_ * 0.5;
    auVar19._16_4_ = auVar117._16_4_ * 0.5;
    auVar19._20_4_ = auVar117._20_4_ * 0.5;
    fVar100 = auVar117._28_4_;
    auVar19._24_4_ = auVar117._24_4_ * 0.5;
    auVar19._28_4_ = fVar100;
    fVar235 = auVar118._0_4_ * 0.5;
    fVar244 = auVar118._4_4_ * 0.5;
    fVar245 = auVar118._8_4_ * 0.5;
    fVar246 = auVar118._12_4_ * 0.5;
    fVar247 = auVar118._16_4_ * 0.5;
    fVar248 = auVar118._20_4_ * 0.5;
    fVar217 = auVar118._24_4_ * 0.5;
    auVar122._4_4_ = fStack_25c * fVar244;
    auVar122._0_4_ = local_260 * fVar235;
    auVar122._8_4_ = fStack_258 * fVar245;
    auVar122._12_4_ = fStack_254 * fVar246;
    auVar122._16_4_ = fStack_250 * fVar247;
    auVar122._20_4_ = fStack_24c * fVar248;
    auVar122._24_4_ = fStack_248 * fVar217;
    auVar122._28_4_ = auVar267._28_4_;
    auVar174._4_4_ = fVar244 * local_580._4_4_;
    auVar174._0_4_ = fVar235 * (float)local_580;
    auVar174._8_4_ = fVar245 * (float)uStack_578;
    auVar174._12_4_ = fVar246 * uStack_578._4_4_;
    auVar174._16_4_ = fVar247 * (float)uStack_570;
    auVar174._20_4_ = fVar248 * uStack_570._4_4_;
    auVar174._24_4_ = fVar217 * (float)uStack_568;
    auVar174._28_4_ = 0x40000000;
    auVar224._4_4_ = fVar244 * local_5a0._4_4_;
    auVar224._0_4_ = fVar235 * (float)local_5a0;
    auVar224._8_4_ = fVar245 * (float)uStack_598;
    auVar224._12_4_ = fVar246 * uStack_598._4_4_;
    auVar224._16_4_ = fVar247 * (float)uStack_590;
    auVar224._20_4_ = fVar248 * uStack_590._4_4_;
    auVar224._24_4_ = fVar217 * (float)uStack_588;
    auVar224._28_4_ = auVar183._28_4_;
    auVar275._4_4_ = fVar244 * local_5c0._4_4_;
    auVar275._0_4_ = fVar235 * (float)local_5c0;
    auVar275._8_4_ = fVar245 * (float)uStack_5b8;
    auVar275._12_4_ = fVar246 * uStack_5b8._4_4_;
    auVar275._16_4_ = fVar247 * (float)uStack_5b0;
    auVar275._20_4_ = fVar248 * uStack_5b0._4_4_;
    auVar275._24_4_ = fVar217 * (float)uStack_5a8;
    auVar275._28_4_ = auVar118._28_4_;
    auVar63._4_4_ = uStack_61c;
    auVar63._0_4_ = local_620;
    auVar63._8_4_ = uStack_618;
    auVar63._12_4_ = uStack_614;
    auVar63._16_4_ = uStack_610;
    auVar63._20_4_ = uStack_60c;
    auVar63._24_4_ = uStack_608;
    auVar63._28_4_ = uStack_604;
    auVar137 = vfmadd231ps_fma(auVar122,auVar19,auVar63);
    auVar73._8_8_ = uStack_518;
    auVar73._0_8_ = local_520;
    auVar73._16_8_ = uStack_510;
    auVar73._24_8_ = uStack_508;
    auVar102 = vfmadd231ps_fma(auVar174,auVar19,auVar73);
    auVar71._8_8_ = uStack_538;
    auVar71._0_8_ = local_540;
    auVar71._16_8_ = uStack_530;
    auVar71._24_8_ = uStack_528;
    auVar138 = vfmadd231ps_fma(auVar224,auVar19,auVar71);
    auVar69._8_8_ = uStack_558;
    auVar69._0_8_ = local_560;
    auVar69._16_8_ = uStack_550;
    auVar69._24_8_ = uStack_548;
    auVar112 = vfmadd231ps_fma(auVar275,auVar19,auVar69);
    auVar65._4_4_ = uStack_5fc;
    auVar65._0_4_ = local_600;
    auVar65._8_4_ = uStack_5f8;
    auVar65._12_4_ = uStack_5f4;
    auVar65._16_4_ = uStack_5f0;
    auVar65._20_4_ = uStack_5ec;
    auVar65._24_4_ = uStack_5e8;
    auVar65._28_4_ = uStack_5e4;
    auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar18,auVar65);
    auVar79._8_8_ = uStack_4b8;
    auVar79._0_8_ = local_4c0;
    auVar79._16_8_ = uStack_4b0;
    auVar79._24_8_ = uStack_4a8;
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar18,auVar79);
    auVar77._8_8_ = uStack_4d8;
    auVar77._0_8_ = local_4e0;
    auVar77._16_8_ = uStack_4d0;
    auVar77._24_8_ = uStack_4c8;
    auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),auVar18,auVar77);
    auVar75._8_8_ = uStack_4f8;
    auVar75._0_8_ = local_500;
    auVar75._16_8_ = uStack_4f0;
    auVar75._24_8_ = uStack_4e8;
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar18,auVar75);
    auVar67._4_4_ = uStack_5dc;
    auVar67._0_4_ = local_5e0;
    auVar67._8_4_ = uStack_5d8;
    auVar67._12_4_ = uStack_5d4;
    auVar67._16_4_ = uStack_5d0;
    auVar67._20_4_ = uStack_5cc;
    auVar67._24_4_ = uStack_5c8;
    auVar67._28_4_ = uStack_5c4;
    auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar17,auVar67);
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar102),auVar17,auVar86);
    auVar81._8_8_ = uStack_498;
    auVar81._0_8_ = local_4a0;
    auVar81._16_8_ = uStack_490;
    auVar81._24_8_ = uStack_488;
    auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),auVar17,auVar81);
    auVar112 = vfmadd231ps_fma(ZEXT1632(auVar112),auVar85,auVar17);
    local_840._0_4_ = auVar137._0_4_ * fVar203;
    local_840._4_4_ = auVar137._4_4_ * fVar203;
    local_840._8_4_ = auVar137._8_4_ * fVar203;
    local_840._12_4_ = auVar137._12_4_ * fVar203;
    local_840._16_4_ = fVar203 * 0.0;
    local_840._20_4_ = fVar203 * 0.0;
    local_840._24_4_ = fVar203 * 0.0;
    local_840._28_4_ = 0;
    fVar247 = auVar102._0_4_ * fVar203;
    fVar228 = auVar102._4_4_ * fVar203;
    auVar240._4_4_ = fVar228;
    auVar240._0_4_ = fVar247;
    fVar231 = auVar102._8_4_ * fVar203;
    auVar240._8_4_ = fVar231;
    fVar292 = auVar102._12_4_ * fVar203;
    auVar240._12_4_ = fVar292;
    auVar240._16_4_ = fVar203 * 0.0;
    auVar240._20_4_ = fVar203 * 0.0;
    auVar240._24_4_ = fVar203 * 0.0;
    auVar240._28_4_ = 0;
    fVar296 = auVar138._0_4_ * fVar203;
    fVar298 = auVar138._4_4_ * fVar203;
    auVar295._4_4_ = fVar298;
    auVar295._0_4_ = fVar296;
    fVar299 = auVar138._8_4_ * fVar203;
    auVar295._8_4_ = fVar299;
    fVar300 = auVar138._12_4_ * fVar203;
    auVar295._12_4_ = fVar300;
    fVar301 = fVar203 * 0.0;
    auVar295._16_4_ = fVar301;
    fVar302 = fVar203 * 0.0;
    auVar295._20_4_ = fVar302;
    fVar303 = fVar203 * 0.0;
    auVar295._24_4_ = fVar303;
    auVar295._28_4_ = 0x3f000000;
    fVar235 = fVar203 * auVar112._0_4_;
    fVar244 = fVar203 * auVar112._4_4_;
    auVar297._4_4_ = fVar244;
    auVar297._0_4_ = fVar235;
    fVar245 = fVar203 * auVar112._8_4_;
    auVar297._8_4_ = fVar245;
    fVar246 = fVar203 * auVar112._12_4_;
    auVar297._12_4_ = fVar246;
    auVar297._16_4_ = fVar203 * 0.0;
    auVar297._20_4_ = fVar203 * 0.0;
    auVar297._24_4_ = fVar203 * 0.0;
    auVar297._28_4_ = fVar100;
    auVar174 = ZEXT1632(auVar104);
    auVar150 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar104));
    _local_960 = vpermps_avx2(_DAT_01fec480,auVar147);
    auVar212 = vpermps_avx2(_DAT_01fec480,ZEXT1632(auVar103));
    auVar14 = vsubps_avx(auVar150,auVar174);
    auVar15 = vsubps_avx(auVar212,ZEXT1632(auVar103));
    fVar248 = auVar15._0_4_;
    fVar217 = auVar15._4_4_;
    auVar11._4_4_ = fVar217 * local_840._4_4_;
    auVar11._0_4_ = fVar248 * local_840._0_4_;
    fVar229 = auVar15._8_4_;
    auVar11._8_4_ = fVar229 * local_840._8_4_;
    fVar230 = auVar15._12_4_;
    auVar11._12_4_ = fVar230 * local_840._12_4_;
    fVar232 = auVar15._16_4_;
    auVar11._16_4_ = fVar232 * local_840._16_4_;
    fVar233 = auVar15._20_4_;
    auVar11._20_4_ = fVar233 * local_840._20_4_;
    fVar214 = auVar15._24_4_;
    auVar11._24_4_ = fVar214 * local_840._24_4_;
    auVar11._28_4_ = auVar212._28_4_;
    auVar104 = vfmsub231ps_fma(auVar11,auVar295,auVar14);
    local_240 = vsubps_avx(_local_960,auVar147);
    fVar263 = auVar14._0_4_;
    fVar264 = auVar14._4_4_;
    auVar13._4_4_ = fVar264 * fVar228;
    auVar13._0_4_ = fVar263 * fVar247;
    fVar282 = auVar14._8_4_;
    auVar13._8_4_ = fVar282 * fVar231;
    fVar283 = auVar14._12_4_;
    auVar13._12_4_ = fVar283 * fVar292;
    fVar284 = auVar14._16_4_;
    auVar13._16_4_ = fVar284 * fVar203 * 0.0;
    fVar285 = auVar14._20_4_;
    auVar13._20_4_ = fVar285 * fVar203 * 0.0;
    fVar286 = auVar14._24_4_;
    auVar13._24_4_ = fVar286 * fVar203 * 0.0;
    auVar13._28_4_ = local_960._28_4_;
    auVar137 = vfmsub231ps_fma(auVar13,local_840,local_240);
    auVar104 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar137._12_4_ * auVar137._12_4_,
                                                  CONCAT48(auVar137._8_4_ * auVar137._8_4_,
                                                           CONCAT44(auVar137._4_4_ * auVar137._4_4_,
                                                                    auVar137._0_4_ * auVar137._0_4_)
                                                          ))),ZEXT1632(auVar104),ZEXT1632(auVar104))
    ;
    fVar228 = local_240._0_4_;
    fVar231 = local_240._4_4_;
    auVar22._4_4_ = fVar231 * fVar298;
    auVar22._0_4_ = fVar228 * fVar296;
    fVar292 = local_240._8_4_;
    auVar22._8_4_ = fVar292 * fVar299;
    fVar215 = local_240._12_4_;
    auVar22._12_4_ = fVar215 * fVar300;
    fVar216 = local_240._16_4_;
    auVar22._16_4_ = fVar216 * fVar301;
    fVar249 = local_240._20_4_;
    auVar22._20_4_ = fVar249 * fVar302;
    fVar262 = local_240._24_4_;
    auVar22._24_4_ = fVar262 * fVar303;
    auVar22._28_4_ = 0;
    auVar102 = vfmsub231ps_fma(auVar22,auVar240,auVar15);
    auVar198._0_4_ = fVar248 * fVar248;
    auVar198._4_4_ = fVar217 * fVar217;
    auVar198._8_4_ = fVar229 * fVar229;
    auVar198._12_4_ = fVar230 * fVar230;
    auVar198._16_4_ = fVar232 * fVar232;
    auVar198._20_4_ = fVar233 * fVar233;
    auVar198._24_4_ = fVar214 * fVar214;
    auVar198._28_4_ = 0;
    auVar137 = vfmadd231ps_fma(auVar198,local_240,local_240);
    auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar14,auVar14);
    auVar117 = vrcpps_avx(ZEXT1632(auVar137));
    auVar102 = vfmadd231ps_fma(ZEXT1632(auVar104),ZEXT1632(auVar102),ZEXT1632(auVar102));
    auVar175._8_4_ = 0x3f800000;
    auVar175._0_8_ = 0x3f8000003f800000;
    auVar175._12_4_ = 0x3f800000;
    auVar175._16_4_ = 0x3f800000;
    auVar175._20_4_ = 0x3f800000;
    auVar175._24_4_ = 0x3f800000;
    auVar175._28_4_ = 0x3f800000;
    auVar104 = vfnmadd213ps_fma(auVar117,ZEXT1632(auVar137),auVar175);
    auVar104 = vfmadd132ps_fma(ZEXT1632(auVar104),auVar117,auVar117);
    local_a00 = vpermps_avx2(_DAT_01fec480,local_840);
    local_a20 = vpermps_avx2(_DAT_01fec480,auVar295);
    auVar23._4_4_ = fVar217 * local_a00._4_4_;
    auVar23._0_4_ = fVar248 * local_a00._0_4_;
    auVar23._8_4_ = fVar229 * local_a00._8_4_;
    auVar23._12_4_ = fVar230 * local_a00._12_4_;
    auVar23._16_4_ = fVar232 * local_a00._16_4_;
    auVar23._20_4_ = fVar233 * local_a00._20_4_;
    auVar23._24_4_ = fVar214 * local_a00._24_4_;
    auVar23._28_4_ = auVar117._28_4_;
    auVar138 = vfmsub231ps_fma(auVar23,local_a20,auVar14);
    auVar17 = vpermps_avx2(_DAT_01fec480,auVar240);
    auVar24._4_4_ = fVar264 * auVar17._4_4_;
    auVar24._0_4_ = fVar263 * auVar17._0_4_;
    auVar24._8_4_ = fVar282 * auVar17._8_4_;
    auVar24._12_4_ = fVar283 * auVar17._12_4_;
    auVar24._16_4_ = fVar284 * auVar17._16_4_;
    auVar24._20_4_ = fVar285 * auVar17._20_4_;
    auVar24._24_4_ = fVar286 * auVar17._24_4_;
    auVar24._28_4_ = 0;
    auVar112 = vfmsub231ps_fma(auVar24,local_a00,local_240);
    auVar138 = vfmadd231ps_fma(ZEXT1632(CONCAT412(auVar112._12_4_ * auVar112._12_4_,
                                                  CONCAT48(auVar112._8_4_ * auVar112._8_4_,
                                                           CONCAT44(auVar112._4_4_ * auVar112._4_4_,
                                                                    auVar112._0_4_ * auVar112._0_4_)
                                                          ))),ZEXT1632(auVar138),ZEXT1632(auVar138))
    ;
    auVar252._0_4_ = fVar228 * local_a20._0_4_;
    auVar252._4_4_ = fVar231 * local_a20._4_4_;
    auVar252._8_4_ = fVar292 * local_a20._8_4_;
    auVar252._12_4_ = fVar215 * local_a20._12_4_;
    auVar252._16_4_ = fVar216 * local_a20._16_4_;
    auVar252._20_4_ = fVar249 * local_a20._20_4_;
    auVar252._24_4_ = fVar262 * local_a20._24_4_;
    auVar252._28_4_ = 0;
    auVar112 = vfmsub231ps_fma(auVar252,auVar17,auVar15);
    auVar138 = vfmadd231ps_fma(ZEXT1632(auVar138),ZEXT1632(auVar112),ZEXT1632(auVar112));
    auVar117 = vmaxps_avx(ZEXT1632(CONCAT412(auVar102._12_4_ * auVar104._12_4_,
                                             CONCAT48(auVar102._8_4_ * auVar104._8_4_,
                                                      CONCAT44(auVar102._4_4_ * auVar104._4_4_,
                                                               auVar102._0_4_ * auVar104._0_4_)))),
                          ZEXT1632(CONCAT412(auVar138._12_4_ * auVar104._12_4_,
                                             CONCAT48(auVar138._8_4_ * auVar104._8_4_,
                                                      CONCAT44(auVar138._4_4_ * auVar104._4_4_,
                                                               auVar138._0_4_ * auVar104._0_4_)))));
    local_860._0_4_ = auVar160._0_4_ + fVar235;
    local_860._4_4_ = auVar160._4_4_ + fVar244;
    local_860._8_4_ = auVar160._8_4_ + fVar245;
    local_860._12_4_ = auVar160._12_4_ + fVar246;
    local_860._16_4_ = fVar203 * 0.0 + 0.0;
    local_860._20_4_ = fVar203 * 0.0 + 0.0;
    local_860._24_4_ = fVar203 * 0.0 + 0.0;
    local_860._28_4_ = fVar100 + 0.0;
    auVar224 = ZEXT1632(auVar160);
    auVar183 = vsubps_avx(auVar224,auVar297);
    auVar18 = vpermps_avx2(_DAT_01fec480,auVar183);
    auVar19 = vpermps_avx2(_DAT_01fec480,auVar224);
    auVar183 = vmaxps_avx(auVar224,local_860);
    auVar118 = vmaxps_avx(auVar18,auVar19);
    auVar12 = vrsqrtps_avx(ZEXT1632(auVar137));
    auVar183 = vmaxps_avx(auVar183,auVar118);
    fVar203 = auVar12._0_4_;
    fVar100 = auVar12._4_4_;
    fVar235 = auVar12._8_4_;
    fVar244 = auVar12._12_4_;
    fVar245 = auVar12._16_4_;
    fVar246 = auVar12._20_4_;
    fVar247 = auVar12._24_4_;
    auVar25._4_4_ = fVar100 * fVar100 * fVar100 * auVar137._4_4_ * -0.5;
    auVar25._0_4_ = fVar203 * fVar203 * fVar203 * auVar137._0_4_ * -0.5;
    auVar25._8_4_ = fVar235 * fVar235 * fVar235 * auVar137._8_4_ * -0.5;
    auVar25._12_4_ = fVar244 * fVar244 * fVar244 * auVar137._12_4_ * -0.5;
    auVar25._16_4_ = fVar245 * fVar245 * fVar245 * -0.0;
    auVar25._20_4_ = fVar246 * fVar246 * fVar246 * -0.0;
    auVar25._24_4_ = fVar247 * fVar247 * fVar247 * -0.0;
    auVar25._28_4_ = local_860._28_4_;
    auVar120._8_4_ = 0x3fc00000;
    auVar120._0_8_ = 0x3fc000003fc00000;
    auVar120._12_4_ = 0x3fc00000;
    auVar120._16_4_ = 0x3fc00000;
    auVar120._20_4_ = 0x3fc00000;
    auVar120._24_4_ = 0x3fc00000;
    auVar120._28_4_ = 0x3fc00000;
    auVar104 = vfmadd231ps_fma(auVar25,auVar120,auVar12);
    fVar100 = auVar104._0_4_;
    fVar244 = auVar104._4_4_;
    auVar26._4_4_ = fVar231 * fVar244;
    auVar26._0_4_ = fVar228 * fVar100;
    fVar247 = auVar104._8_4_;
    auVar26._8_4_ = fVar292 * fVar247;
    fVar228 = auVar104._12_4_;
    auVar26._12_4_ = fVar215 * fVar228;
    auVar26._16_4_ = fVar216 * 0.0;
    auVar26._20_4_ = fVar249 * 0.0;
    auVar26._24_4_ = fVar262 * 0.0;
    auVar26._28_4_ = 0;
    auVar27._4_4_ = fVar98 * fVar217 * fVar244;
    auVar27._0_4_ = fVar98 * fVar248 * fVar100;
    auVar27._8_4_ = fVar98 * fVar229 * fVar247;
    auVar27._12_4_ = fVar98 * fVar230 * fVar228;
    auVar27._16_4_ = fVar98 * fVar232 * 0.0;
    auVar27._20_4_ = fVar98 * fVar233 * 0.0;
    auVar27._24_4_ = fVar98 * fVar214 * 0.0;
    auVar27._28_4_ = local_240._28_4_;
    auVar160 = vfmadd231ps_fma(auVar27,auVar26,_local_a60);
    auVar295 = ZEXT1632(auVar103);
    auVar121 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar118 = vsubps_avx(auVar121,auVar295);
    fVar235 = auVar118._0_4_;
    fVar245 = auVar118._4_4_;
    auVar28._4_4_ = fVar217 * fVar244 * fVar245;
    auVar28._0_4_ = fVar248 * fVar100 * fVar235;
    fVar248 = auVar118._8_4_;
    auVar28._8_4_ = fVar229 * fVar247 * fVar248;
    fVar229 = auVar118._12_4_;
    auVar28._12_4_ = fVar230 * fVar228 * fVar229;
    fVar231 = auVar118._16_4_;
    auVar28._16_4_ = fVar232 * 0.0 * fVar231;
    fVar232 = auVar118._20_4_;
    auVar28._20_4_ = fVar233 * 0.0 * fVar232;
    fVar233 = auVar118._24_4_;
    auVar28._24_4_ = fVar214 * 0.0 * fVar233;
    auVar28._28_4_ = local_a20._28_4_;
    auVar121 = vsubps_avx(auVar121,auVar147);
    auVar103 = vfmadd231ps_fma(auVar28,auVar121,auVar26);
    auVar29._4_4_ = fVar264 * fVar244;
    auVar29._0_4_ = fVar263 * fVar100;
    auVar29._8_4_ = fVar282 * fVar247;
    auVar29._12_4_ = fVar283 * fVar228;
    auVar29._16_4_ = fVar284 * 0.0;
    auVar29._20_4_ = fVar285 * 0.0;
    auVar29._24_4_ = fVar286 * 0.0;
    auVar29._28_4_ = 0;
    auVar160 = vfmadd231ps_fma(ZEXT1632(auVar160),auVar29,_local_880);
    auVar276 = ZEXT1664(auVar160);
    auVar122 = ZEXT1232(ZEXT812(0)) << 0x20;
    auVar126 = vsubps_avx(auVar122,auVar174);
    auVar281 = ZEXT3264(auVar126);
    auVar103 = vfmadd231ps_fma(ZEXT1632(auVar103),auVar126,auVar29);
    auVar30._4_4_ = fVar98 * fVar245;
    auVar30._0_4_ = fVar98 * fVar235;
    auVar30._8_4_ = fVar98 * fVar248;
    auVar30._12_4_ = fVar98 * fVar229;
    auVar30._16_4_ = fVar98 * fVar231;
    auVar30._20_4_ = fVar98 * fVar232;
    auVar30._24_4_ = fVar98 * fVar233;
    auVar30._28_4_ = 0;
    auVar137 = vfmadd231ps_fma(auVar30,_local_a60,auVar121);
    auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),_local_880,auVar126);
    fVar203 = auVar103._0_4_;
    fVar249 = auVar160._0_4_;
    fVar246 = auVar103._4_4_;
    fVar262 = auVar160._4_4_;
    fVar217 = auVar103._8_4_;
    fVar263 = auVar160._8_4_;
    fVar230 = auVar103._12_4_;
    fVar264 = auVar160._12_4_;
    auVar31._28_4_ = auVar12._28_4_;
    auVar31._0_28_ =
         ZEXT1628(CONCAT412(fVar264 * fVar230,
                            CONCAT48(fVar263 * fVar217,CONCAT44(fVar262 * fVar246,fVar249 * fVar203)
                                    )));
    auVar16 = vsubps_avx(ZEXT1632(auVar137),auVar31);
    auVar32._4_4_ = fVar245 * fVar245;
    auVar32._0_4_ = fVar235 * fVar235;
    auVar32._8_4_ = fVar248 * fVar248;
    auVar32._12_4_ = fVar229 * fVar229;
    auVar32._16_4_ = fVar231 * fVar231;
    auVar32._20_4_ = fVar232 * fVar232;
    auVar32._24_4_ = fVar233 * fVar233;
    auVar32._28_4_ = auVar12._28_4_;
    auVar137 = vfmadd231ps_fma(auVar32,auVar121,auVar121);
    auVar137 = vfmadd231ps_fma(ZEXT1632(auVar137),auVar126,auVar126);
    auVar12 = vsubps_avx(ZEXT1632(auVar137),
                         ZEXT1632(CONCAT412(fVar230 * fVar230,
                                            CONCAT48(fVar217 * fVar217,
                                                     CONCAT44(fVar246 * fVar246,fVar203 * fVar203)))
                                 ));
    auVar118 = vsqrtps_avx(auVar117);
    fVar216 = auVar118._28_4_ + auVar183._28_4_;
    fVar203 = (auVar118._0_4_ + auVar183._0_4_) * 1.0000002;
    fVar246 = (auVar118._4_4_ + auVar183._4_4_) * 1.0000002;
    fVar217 = (auVar118._8_4_ + auVar183._8_4_) * 1.0000002;
    fVar230 = (auVar118._12_4_ + auVar183._12_4_) * 1.0000002;
    fVar214 = (auVar118._16_4_ + auVar183._16_4_) * 1.0000002;
    fVar292 = (auVar118._20_4_ + auVar183._20_4_) * 1.0000002;
    fVar215 = (auVar118._24_4_ + auVar183._24_4_) * 1.0000002;
    auVar33._4_4_ = fVar246 * fVar246;
    auVar33._0_4_ = fVar203 * fVar203;
    auVar33._8_4_ = fVar217 * fVar217;
    auVar33._12_4_ = fVar230 * fVar230;
    auVar33._16_4_ = fVar214 * fVar214;
    auVar33._20_4_ = fVar292 * fVar292;
    auVar33._24_4_ = fVar215 * fVar215;
    auVar33._28_4_ = fVar216;
    fVar246 = auVar16._0_4_ + auVar16._0_4_;
    fVar217 = auVar16._4_4_ + auVar16._4_4_;
    auVar253._0_8_ = CONCAT44(fVar217,fVar246);
    auVar253._8_4_ = auVar16._8_4_ + auVar16._8_4_;
    auVar253._12_4_ = auVar16._12_4_ + auVar16._12_4_;
    auVar253._16_4_ = auVar16._16_4_ + auVar16._16_4_;
    auVar253._20_4_ = auVar16._20_4_ + auVar16._20_4_;
    auVar253._24_4_ = auVar16._24_4_ + auVar16._24_4_;
    fVar203 = auVar16._28_4_;
    auVar253._28_4_ = fVar203 + fVar203;
    auVar183 = vsubps_avx(auVar12,auVar33);
    auVar243 = ZEXT3264(auVar183);
    auVar275 = ZEXT1632(auVar160);
    auVar34._28_4_ = fVar216;
    auVar34._0_28_ =
         ZEXT1628(CONCAT412(fVar264 * fVar264,
                            CONCAT48(fVar263 * fVar263,CONCAT44(fVar262 * fVar262,fVar249 * fVar249)
                                    )));
    local_6a0 = vsubps_avx(local_220,auVar34);
    auVar267 = ZEXT3264(local_6a0);
    auVar35._4_4_ = fVar217 * fVar217;
    auVar35._0_4_ = fVar246 * fVar246;
    auVar35._8_4_ = auVar253._8_4_ * auVar253._8_4_;
    auVar35._12_4_ = auVar253._12_4_ * auVar253._12_4_;
    auVar35._16_4_ = auVar253._16_4_ * auVar253._16_4_;
    auVar35._20_4_ = auVar253._20_4_ * auVar253._20_4_;
    auVar35._24_4_ = auVar253._24_4_ * auVar253._24_4_;
    auVar35._28_4_ = 0;
    fVar230 = local_6a0._0_4_;
    fVar214 = local_6a0._4_4_;
    fVar292 = local_6a0._8_4_;
    fVar215 = local_6a0._12_4_;
    fVar216 = local_6a0._16_4_;
    fVar249 = local_6a0._20_4_;
    fVar262 = local_6a0._24_4_;
    auVar36._4_4_ = fVar214 * 4.0 * auVar183._4_4_;
    auVar36._0_4_ = fVar230 * 4.0 * auVar183._0_4_;
    auVar36._8_4_ = fVar292 * 4.0 * auVar183._8_4_;
    auVar36._12_4_ = fVar215 * 4.0 * auVar183._12_4_;
    auVar36._16_4_ = fVar216 * 4.0 * auVar183._16_4_;
    auVar36._20_4_ = fVar249 * 4.0 * auVar183._20_4_;
    auVar36._24_4_ = fVar262 * 4.0 * auVar183._24_4_;
    auVar36._28_4_ = fVar203;
    auVar16 = vsubps_avx(auVar35,auVar36);
    auVar117 = vcmpps_avx(auVar16,auVar122,5);
    auVar297 = ZEXT1632(auVar103);
    fVar203 = local_6a0._28_4_;
    if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
             (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
            (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
           SUB321(auVar117 >> 0x7f,0) == '\0') &&
          (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
         SUB321(auVar117 >> 0xbf,0) == '\0') &&
        (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) && -1 < auVar117[0x1f])
    {
      auVar225._8_4_ = 0x7f800000;
      auVar225._0_8_ = 0x7f8000007f800000;
      auVar225._12_4_ = 0x7f800000;
      auVar225._16_4_ = 0x7f800000;
      auVar225._20_4_ = 0x7f800000;
      auVar225._24_4_ = 0x7f800000;
      auVar225._28_4_ = 0x7f800000;
      auVar199._8_4_ = 0xff800000;
      auVar199._0_8_ = 0xff800000ff800000;
      auVar199._12_4_ = 0xff800000;
      auVar199._16_4_ = 0xff800000;
      auVar199._20_4_ = 0xff800000;
      auVar199._24_4_ = 0xff800000;
      auVar199._28_4_ = 0xff800000;
    }
    else {
      auVar13 = vsqrtps_avx(auVar16);
      auVar287._0_4_ = fVar230 + fVar230;
      auVar287._4_4_ = fVar214 + fVar214;
      auVar287._8_4_ = fVar292 + fVar292;
      auVar287._12_4_ = fVar215 + fVar215;
      auVar287._16_4_ = fVar216 + fVar216;
      auVar287._20_4_ = fVar249 + fVar249;
      auVar287._24_4_ = fVar262 + fVar262;
      auVar287._28_4_ = fVar203 + fVar203;
      auVar11 = vrcpps_avx(auVar287);
      auVar122 = vcmpps_avx(auVar16,auVar122,5);
      auVar123._8_4_ = 0x3f800000;
      auVar123._0_8_ = 0x3f8000003f800000;
      auVar123._12_4_ = 0x3f800000;
      auVar123._16_4_ = 0x3f800000;
      auVar123._20_4_ = 0x3f800000;
      auVar123._24_4_ = 0x3f800000;
      auVar123._28_4_ = 0x3f800000;
      auVar103 = vfnmadd213ps_fma(auVar287,auVar11,auVar123);
      auVar103 = vfmadd132ps_fma(ZEXT1632(auVar103),auVar11,auVar11);
      auVar200._0_8_ = CONCAT44(fVar217,fVar246) ^ 0x8000000080000000;
      auVar200._8_4_ = -auVar253._8_4_;
      auVar200._12_4_ = -auVar253._12_4_;
      auVar200._16_4_ = -auVar253._16_4_;
      auVar200._20_4_ = -auVar253._20_4_;
      auVar200._24_4_ = -auVar253._24_4_;
      auVar200._28_4_ = -auVar253._28_4_;
      auVar16 = vsubps_avx(auVar200,auVar13);
      auVar37._4_4_ = auVar103._4_4_ * auVar16._4_4_;
      auVar37._0_4_ = auVar103._0_4_ * auVar16._0_4_;
      auVar37._8_4_ = auVar103._8_4_ * auVar16._8_4_;
      auVar37._12_4_ = auVar103._12_4_ * auVar16._12_4_;
      auVar37._16_4_ = auVar16._16_4_ * 0.0;
      auVar37._20_4_ = auVar16._20_4_ * 0.0;
      auVar37._24_4_ = auVar16._24_4_ * 0.0;
      auVar37._28_4_ = auVar16._28_4_;
      auVar16 = vsubps_avx(auVar13,auVar253);
      auVar38._4_4_ = auVar103._4_4_ * auVar16._4_4_;
      auVar38._0_4_ = auVar103._0_4_ * auVar16._0_4_;
      auVar38._8_4_ = auVar103._8_4_ * auVar16._8_4_;
      auVar38._12_4_ = auVar103._12_4_ * auVar16._12_4_;
      auVar38._16_4_ = auVar16._16_4_ * 0.0;
      auVar38._20_4_ = auVar16._20_4_ * 0.0;
      auVar38._24_4_ = auVar16._24_4_ * 0.0;
      auVar38._28_4_ = auVar16._28_4_;
      auVar103 = vfmadd213ps_fma(auVar275,auVar37,auVar297);
      local_2a0 = auVar103._0_4_ * fVar100;
      fStack_29c = auVar103._4_4_ * fVar244;
      fStack_298 = auVar103._8_4_ * fVar247;
      fStack_294 = auVar103._12_4_ * fVar228;
      uStack_290 = 0;
      uStack_28c = 0;
      uStack_288 = 0;
      uStack_284 = 0x3f800000;
      auVar58._4_4_ = uStack_8bc;
      auVar58._0_4_ = local_8c0;
      auVar58._8_4_ = uStack_8b8;
      auVar58._12_4_ = uStack_8b4;
      auVar58._16_4_ = uStack_8b0;
      auVar58._20_4_ = uStack_8ac;
      auVar58._24_4_ = uStack_8a8;
      auVar58._28_4_ = uStack_8a4;
      auVar16 = vandps_avx(auVar34,auVar58);
      auVar16 = vmaxps_avx(local_640,auVar16);
      auVar39._4_4_ = auVar16._4_4_ * 1.9073486e-06;
      auVar39._0_4_ = auVar16._0_4_ * 1.9073486e-06;
      auVar39._8_4_ = auVar16._8_4_ * 1.9073486e-06;
      auVar39._12_4_ = auVar16._12_4_ * 1.9073486e-06;
      auVar39._16_4_ = auVar16._16_4_ * 1.9073486e-06;
      auVar39._20_4_ = auVar16._20_4_ * 1.9073486e-06;
      auVar39._24_4_ = auVar16._24_4_ * 1.9073486e-06;
      auVar39._28_4_ = auVar16._28_4_;
      auVar16 = vandps_avx(local_6a0,auVar58);
      auVar16 = vcmpps_avx(auVar16,auVar39,1);
      auVar103 = vfmadd213ps_fma(auVar275,auVar38,auVar297);
      auVar124._8_4_ = 0x7f800000;
      auVar124._0_8_ = 0x7f8000007f800000;
      auVar124._12_4_ = 0x7f800000;
      auVar124._16_4_ = 0x7f800000;
      auVar124._20_4_ = 0x7f800000;
      auVar124._24_4_ = 0x7f800000;
      auVar124._28_4_ = 0x7f800000;
      auVar225 = vblendvps_avx(auVar124,auVar37,auVar122);
      local_2e0 = auVar103._0_4_ * fVar100;
      fStack_2dc = auVar103._4_4_ * fVar244;
      fStack_2d8 = auVar103._8_4_ * fVar247;
      fStack_2d4 = auVar103._12_4_ * fVar228;
      uStack_2d0 = 0;
      uStack_2cc = 0;
      uStack_2c8 = 0;
      uStack_2c4 = 0x7f800000;
      auVar125._8_4_ = 0xff800000;
      auVar125._0_8_ = 0xff800000ff800000;
      auVar125._12_4_ = 0xff800000;
      auVar125._16_4_ = 0xff800000;
      auVar125._20_4_ = 0xff800000;
      auVar125._24_4_ = 0xff800000;
      auVar125._28_4_ = 0xff800000;
      auVar199 = vblendvps_avx(auVar125,auVar38,auVar122);
      auVar11 = auVar122 & auVar16;
      if ((((((((auVar11 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar11 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar11 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar11 >> 0x7f,0) != '\0') ||
            (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar11 >> 0xbf,0) != '\0') ||
          (auVar11 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar11[0x1f] < '\0') {
        auVar117 = vandps_avx(auVar16,auVar122);
        auVar16 = vcmpps_avx(auVar183,_DAT_01faff00,2);
        auVar243 = ZEXT3264(auVar16);
        auVar133._8_4_ = 0xff800000;
        auVar133._0_8_ = 0xff800000ff800000;
        auVar133._12_4_ = 0xff800000;
        auVar133._16_4_ = 0xff800000;
        auVar133._20_4_ = 0xff800000;
        auVar133._24_4_ = 0xff800000;
        auVar133._28_4_ = 0xff800000;
        auVar157._8_4_ = 0x7f800000;
        auVar157._0_8_ = 0x7f8000007f800000;
        auVar157._12_4_ = 0x7f800000;
        auVar157._16_4_ = 0x7f800000;
        auVar157._20_4_ = 0x7f800000;
        auVar157._24_4_ = 0x7f800000;
        auVar157._28_4_ = 0x7f800000;
        auVar183 = vblendvps_avx(auVar157,auVar133,auVar16);
        auVar103 = vpackssdw_avx(auVar117._0_16_,auVar117._16_16_);
        auVar11 = vpmovsxwd_avx2(auVar103);
        auVar225 = vblendvps_avx(auVar225,auVar183,auVar11);
        auVar183 = vblendvps_avx(auVar133,auVar157,auVar16);
        auVar199 = vblendvps_avx(auVar199,auVar183,auVar11);
        auVar213._0_8_ = auVar117._0_8_ ^ 0xffffffffffffffff;
        auVar213._8_4_ = auVar117._8_4_ ^ 0xffffffff;
        auVar213._12_4_ = auVar117._12_4_ ^ 0xffffffff;
        auVar213._16_4_ = auVar117._16_4_ ^ 0xffffffff;
        auVar213._20_4_ = auVar117._20_4_ ^ 0xffffffff;
        auVar213._24_4_ = auVar117._24_4_ ^ 0xffffffff;
        auVar213._28_4_ = auVar117._28_4_ ^ 0xffffffff;
        auVar117 = vorps_avx(auVar16,auVar213);
        auVar117 = vandps_avx(auVar122,auVar117);
      }
    }
    auVar291 = ZEXT3264(auVar272);
    auVar261 = ZEXT3264(auVar253);
    auVar183 = local_800 & auVar117;
    if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar183 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar183 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar183 >> 0x7f,0) != '\0') ||
          (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar183 >> 0xbf,0) != '\0') ||
        (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar183[0x1f] < '\0') {
      local_2c0 = ZEXT1632(auVar104);
      fVar246 = *(float *)(ray + k * 4 + 0x100);
      local_6f0 = ZEXT416((uint)fVar246);
      fVar217 = fVar246 - (float)local_920._0_4_;
      auVar211._4_4_ = fVar217;
      auVar211._0_4_ = fVar217;
      auVar211._8_4_ = fVar217;
      auVar211._12_4_ = fVar217;
      auVar211._16_4_ = fVar217;
      auVar211._20_4_ = fVar217;
      auVar211._24_4_ = fVar217;
      auVar211._28_4_ = fVar217;
      auVar122 = vminps_avx(auVar211,auVar199);
      auVar40._4_4_ = fVar245 * fVar298;
      auVar40._0_4_ = fVar235 * fVar296;
      auVar40._8_4_ = fVar248 * fVar299;
      auVar40._12_4_ = fVar229 * fVar300;
      auVar40._16_4_ = fVar231 * fVar301;
      auVar40._20_4_ = fVar232 * fVar302;
      auVar40._24_4_ = fVar233 * fVar303;
      auVar40._28_4_ = fVar217;
      auVar104 = vfmadd213ps_fma(auVar121,auVar240,auVar40);
      auVar84._4_4_ = fStack_27c;
      auVar84._0_4_ = local_280;
      auVar84._8_4_ = fStack_278;
      auVar84._12_4_ = fStack_274;
      auVar84._16_4_ = fStack_270;
      auVar84._20_4_ = fStack_26c;
      auVar84._24_4_ = fStack_268;
      auVar84._28_4_ = fStack_264;
      auVar16 = vmaxps_avx(auVar84,auVar225);
      auVar103 = vfmadd213ps_fma(auVar126,local_840,ZEXT1632(auVar104));
      auVar41._4_4_ = fVar98 * fVar298;
      auVar41._0_4_ = fVar98 * fVar296;
      auVar41._8_4_ = fVar98 * fVar299;
      auVar41._12_4_ = fVar98 * fVar300;
      auVar41._16_4_ = fVar98 * fVar301;
      auVar41._20_4_ = fVar98 * fVar302;
      auVar41._24_4_ = fVar98 * fVar303;
      auVar41._28_4_ = 0x3f000000;
      auVar104 = vfmadd231ps_fma(auVar41,_local_a60,auVar240);
      auVar160 = vfmadd231ps_fma(ZEXT1632(auVar104),_local_880,local_840);
      auVar267 = ZEXT3264(auVar117);
      auVar59._4_4_ = uStack_8bc;
      auVar59._0_4_ = local_8c0;
      auVar59._8_4_ = uStack_8b8;
      auVar59._12_4_ = uStack_8b4;
      auVar59._16_4_ = uStack_8b0;
      auVar59._20_4_ = uStack_8ac;
      auVar59._24_4_ = uStack_8a8;
      auVar59._28_4_ = uStack_8a4;
      auVar183 = vandps_avx(auVar59,ZEXT1632(auVar160));
      auVar148._8_4_ = 0x219392ef;
      auVar148._0_8_ = 0x219392ef219392ef;
      auVar148._12_4_ = 0x219392ef;
      auVar148._16_4_ = 0x219392ef;
      auVar148._20_4_ = 0x219392ef;
      auVar148._24_4_ = 0x219392ef;
      auVar148._28_4_ = 0x219392ef;
      auVar121 = vcmpps_avx(auVar183,auVar148,1);
      auVar183 = vrcpps_avx(ZEXT1632(auVar160));
      auVar226._8_4_ = 0x3f800000;
      auVar226._0_8_ = 0x3f8000003f800000;
      auVar226._12_4_ = 0x3f800000;
      auVar226._16_4_ = 0x3f800000;
      auVar226._20_4_ = 0x3f800000;
      auVar226._24_4_ = 0x3f800000;
      auVar226._28_4_ = 0x3f800000;
      auVar240 = ZEXT1632(auVar160);
      auVar104 = vfnmadd213ps_fma(auVar183,auVar240,auVar226);
      auVar104 = vfmadd132ps_fma(ZEXT1632(auVar104),auVar183,auVar183);
      auVar288._0_8_ = auVar160._0_8_ ^ 0x8000000080000000;
      auVar288._8_4_ = auVar160._8_4_ ^ 0x80000000;
      auVar288._12_4_ = auVar160._12_4_ ^ 0x80000000;
      auVar288._16_4_ = 0x80000000;
      auVar288._20_4_ = 0x80000000;
      auVar288._24_4_ = 0x80000000;
      auVar288._28_4_ = 0x80000000;
      auVar42._4_4_ = auVar104._4_4_ * -auVar103._4_4_;
      auVar42._0_4_ = auVar104._0_4_ * -auVar103._0_4_;
      auVar42._8_4_ = auVar104._8_4_ * -auVar103._8_4_;
      auVar42._12_4_ = auVar104._12_4_ * -auVar103._12_4_;
      auVar42._16_4_ = 0x80000000;
      auVar42._20_4_ = 0x80000000;
      auVar42._24_4_ = 0x80000000;
      auVar42._28_4_ = 0x80000000;
      auVar183 = vcmpps_avx(auVar240,auVar288,1);
      auVar183 = vorps_avx(auVar121,auVar183);
      auVar278._8_4_ = 0xff800000;
      auVar278._0_8_ = 0xff800000ff800000;
      auVar278._12_4_ = 0xff800000;
      auVar278._16_4_ = 0xff800000;
      auVar278._20_4_ = 0xff800000;
      auVar278._24_4_ = 0xff800000;
      auVar278._28_4_ = 0xff800000;
      auVar183 = vblendvps_avx(auVar42,auVar278,auVar183);
      auVar126 = vmaxps_avx(auVar16,auVar183);
      auVar183 = vcmpps_avx(auVar240,auVar288,6);
      auVar183 = vorps_avx(auVar121,auVar183);
      auVar289._8_4_ = 0x7f800000;
      auVar289._0_8_ = 0x7f8000007f800000;
      auVar289._12_4_ = 0x7f800000;
      auVar289._16_4_ = 0x7f800000;
      auVar289._20_4_ = 0x7f800000;
      auVar289._24_4_ = 0x7f800000;
      auVar289._28_4_ = 0x7f800000;
      auVar183 = vblendvps_avx(auVar42,auVar289,auVar183);
      auVar16 = vminps_avx(auVar122,auVar183);
      fVar235 = -local_a20._0_4_;
      fVar245 = -local_a20._4_4_;
      fVar248 = -local_a20._8_4_;
      fVar217 = -local_a20._12_4_;
      fVar229 = -local_a20._16_4_;
      fVar231 = -local_a20._20_4_;
      fVar232 = -local_a20._24_4_;
      uStack_b24 = auVar17._28_4_;
      auVar241._0_8_ = auVar17._0_8_ ^ 0x8000000080000000;
      auVar241._8_4_ = -auVar17._8_4_;
      auVar241._12_4_ = -auVar17._12_4_;
      auVar241._16_4_ = -auVar17._16_4_;
      auVar241._20_4_ = -auVar17._20_4_;
      auVar241._24_4_ = -auVar17._24_4_;
      auVar241._28_4_ = uStack_b24 ^ 0x80000000;
      auVar121 = ZEXT1232(ZEXT812(0)) << 0x20;
      auVar183 = vsubps_avx(auVar121,_local_960);
      auVar121 = vsubps_avx(auVar121,auVar212);
      auVar43._4_4_ = auVar121._4_4_ * fVar245;
      auVar43._0_4_ = auVar121._0_4_ * fVar235;
      auVar43._8_4_ = auVar121._8_4_ * fVar248;
      auVar43._12_4_ = auVar121._12_4_ * fVar217;
      auVar43._16_4_ = auVar121._16_4_ * fVar229;
      auVar43._20_4_ = auVar121._20_4_ * fVar231;
      auVar43._24_4_ = auVar121._24_4_ * fVar232;
      auVar43._28_4_ = auVar121._28_4_;
      auVar104 = vfmadd231ps_fma(auVar43,auVar241,auVar183);
      auVar254._0_8_ = local_a00._0_8_ ^ 0x8000000080000000;
      auVar254._8_4_ = -local_a00._8_4_;
      auVar254._12_4_ = -local_a00._12_4_;
      auVar254._16_4_ = -local_a00._16_4_;
      auVar254._20_4_ = -local_a00._20_4_;
      auVar254._24_4_ = -local_a00._24_4_;
      auVar254._28_4_ = local_a00._28_4_ ^ 0x80000000;
      auVar183 = vsubps_avx(ZEXT1232(ZEXT812(0)) << 0x20,auVar150);
      auVar103 = vfmadd231ps_fma(ZEXT1632(auVar104),auVar254,auVar183);
      auVar44._4_4_ = fVar245 * fVar98;
      auVar44._0_4_ = fVar235 * fVar98;
      auVar44._8_4_ = fVar248 * fVar98;
      auVar44._12_4_ = fVar217 * fVar98;
      auVar44._16_4_ = fVar229 * fVar98;
      auVar44._20_4_ = fVar231 * fVar98;
      auVar44._24_4_ = fVar232 * fVar98;
      auVar44._28_4_ = local_a20._28_4_ ^ 0x80000000;
      auVar104 = vfmadd231ps_fma(auVar44,_local_a60,auVar241);
      auVar160 = vfmadd231ps_fma(ZEXT1632(auVar104),_local_880,auVar254);
      auVar183 = vandps_avx(auVar59,ZEXT1632(auVar160));
      auVar150 = vrcpps_avx(ZEXT1632(auVar160));
      auVar176._8_4_ = 0x219392ef;
      auVar176._0_8_ = 0x219392ef219392ef;
      auVar176._12_4_ = 0x219392ef;
      auVar176._16_4_ = 0x219392ef;
      auVar176._20_4_ = 0x219392ef;
      auVar176._24_4_ = 0x219392ef;
      auVar176._28_4_ = 0x219392ef;
      auVar121 = vcmpps_avx(auVar183,auVar176,1);
      auVar212 = ZEXT1632(auVar160);
      auVar104 = vfnmadd213ps_fma(auVar150,auVar212,auVar226);
      auVar104 = vfmadd132ps_fma(ZEXT1632(auVar104),auVar150,auVar150);
      auVar255._0_8_ = auVar160._0_8_ ^ 0x8000000080000000;
      auVar255._8_4_ = auVar160._8_4_ ^ 0x80000000;
      auVar255._12_4_ = auVar160._12_4_ ^ 0x80000000;
      auVar255._16_4_ = 0x80000000;
      auVar255._20_4_ = 0x80000000;
      auVar255._24_4_ = 0x80000000;
      auVar255._28_4_ = 0x80000000;
      auVar261 = ZEXT3264(auVar255);
      auVar45._4_4_ = auVar104._4_4_ * -auVar103._4_4_;
      auVar45._0_4_ = auVar104._0_4_ * -auVar103._0_4_;
      auVar45._8_4_ = auVar104._8_4_ * -auVar103._8_4_;
      auVar45._12_4_ = auVar104._12_4_ * -auVar103._12_4_;
      auVar45._16_4_ = 0x80000000;
      auVar45._20_4_ = 0x80000000;
      auVar45._24_4_ = 0x80000000;
      auVar45._28_4_ = 0x80000000;
      auVar183 = vcmpps_avx(auVar212,auVar255,1);
      auVar183 = vorps_avx(auVar183,auVar121);
      auVar149._8_4_ = 0xff800000;
      auVar149._0_8_ = 0xff800000ff800000;
      auVar149._12_4_ = 0xff800000;
      auVar149._16_4_ = 0xff800000;
      auVar149._20_4_ = 0xff800000;
      auVar149._24_4_ = 0xff800000;
      auVar149._28_4_ = 0xff800000;
      auVar183 = vblendvps_avx(auVar45,auVar149,auVar183);
      auVar281 = ZEXT3264(auVar183);
      local_9c0 = vmaxps_avx(auVar126,auVar183);
      auVar183 = vcmpps_avx(auVar212,auVar255,6);
      auVar183 = vorps_avx(auVar121,auVar183);
      auVar177._8_4_ = 0x7f800000;
      auVar177._0_8_ = 0x7f8000007f800000;
      auVar177._12_4_ = 0x7f800000;
      auVar177._16_4_ = 0x7f800000;
      auVar177._20_4_ = 0x7f800000;
      auVar177._24_4_ = 0x7f800000;
      auVar177._28_4_ = 0x7f800000;
      auVar183 = vblendvps_avx(auVar45,auVar177,auVar183);
      auVar117 = vandps_avx(auVar117,local_800);
      local_300 = vminps_avx(auVar16,auVar183);
      auVar183 = vcmpps_avx(local_9c0,local_300,2);
      auVar126 = auVar117 & auVar183;
      if ((((((((auVar126 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
               (auVar126 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
              (auVar126 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
             SUB321(auVar126 >> 0x7f,0) == '\0') &&
            (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
           SUB321(auVar126 >> 0xbf,0) == '\0') &&
          (auVar126 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
          -1 < auVar126[0x1f]) {
LAB_01611559:
        auVar243 = ZEXT3264(auVar121);
        auVar291 = ZEXT3264(auVar16);
      }
      else {
        auVar83._4_4_ = fStack_29c;
        auVar83._0_4_ = local_2a0;
        auVar83._8_4_ = fStack_298;
        auVar83._12_4_ = fStack_294;
        auVar83._16_4_ = uStack_290;
        auVar83._20_4_ = uStack_28c;
        auVar83._24_4_ = uStack_288;
        auVar83._28_4_ = uStack_284;
        auVar121 = vminps_avx(auVar83,auVar226);
        auVar57 = ZEXT812(0);
        auVar291 = ZEXT1264(auVar57) << 0x20;
        auVar121 = vmaxps_avx(auVar121,ZEXT1232(auVar57) << 0x20);
        auVar82._4_4_ = fStack_2dc;
        auVar82._0_4_ = local_2e0;
        auVar82._8_4_ = fStack_2d8;
        auVar82._12_4_ = fStack_2d4;
        auVar82._16_4_ = uStack_2d0;
        auVar82._20_4_ = uStack_2cc;
        auVar82._24_4_ = uStack_2c8;
        auVar82._28_4_ = uStack_2c4;
        auVar126 = vminps_avx(auVar82,auVar226);
        auVar126 = vmaxps_avx(auVar126,ZEXT1232(auVar57) << 0x20);
        auVar46._4_4_ = (auVar121._4_4_ + 1.0) * 0.125;
        auVar46._0_4_ = (auVar121._0_4_ + 0.0) * 0.125;
        auVar46._8_4_ = (auVar121._8_4_ + 2.0) * 0.125;
        auVar46._12_4_ = (auVar121._12_4_ + 3.0) * 0.125;
        auVar46._16_4_ = (auVar121._16_4_ + 4.0) * 0.125;
        auVar46._20_4_ = (auVar121._20_4_ + 5.0) * 0.125;
        auVar46._24_4_ = (auVar121._24_4_ + 6.0) * 0.125;
        auVar46._28_4_ = auVar121._28_4_ + 7.0;
        auVar104 = vfmadd213ps_fma(auVar46,local_9a0,local_a40);
        auVar47._4_4_ = (auVar126._4_4_ + 1.0) * 0.125;
        auVar47._0_4_ = (auVar126._0_4_ + 0.0) * 0.125;
        auVar47._8_4_ = (auVar126._8_4_ + 2.0) * 0.125;
        auVar47._12_4_ = (auVar126._12_4_ + 3.0) * 0.125;
        auVar47._16_4_ = (auVar126._16_4_ + 4.0) * 0.125;
        auVar47._20_4_ = (auVar126._20_4_ + 5.0) * 0.125;
        auVar47._24_4_ = (auVar126._24_4_ + 6.0) * 0.125;
        auVar47._28_4_ = auVar126._28_4_ + 7.0;
        auVar103 = vfmadd213ps_fma(auVar47,local_9a0,local_a40);
        auVar121 = vminps_avx(auVar224,local_860);
        auVar126 = vminps_avx(auVar18,auVar19);
        auVar121 = vminps_avx(auVar121,auVar126);
        auVar118 = vsubps_avx(auVar121,auVar118);
        auVar117 = vandps_avx(auVar183,auVar117);
        local_1a0 = ZEXT1632(auVar104);
        local_1c0 = ZEXT1632(auVar103);
        auVar48._4_4_ = auVar118._4_4_ * 0.99999976;
        auVar48._0_4_ = auVar118._0_4_ * 0.99999976;
        auVar48._8_4_ = auVar118._8_4_ * 0.99999976;
        auVar48._12_4_ = auVar118._12_4_ * 0.99999976;
        auVar48._16_4_ = auVar118._16_4_ * 0.99999976;
        auVar48._20_4_ = auVar118._20_4_ * 0.99999976;
        auVar48._24_4_ = auVar118._24_4_ * 0.99999976;
        auVar48._28_4_ = auVar118._28_4_;
        auVar183 = vmaxps_avx(ZEXT832(0) << 0x20,auVar48);
        auVar49._4_4_ = auVar183._4_4_ * auVar183._4_4_;
        auVar49._0_4_ = auVar183._0_4_ * auVar183._0_4_;
        auVar49._8_4_ = auVar183._8_4_ * auVar183._8_4_;
        auVar49._12_4_ = auVar183._12_4_ * auVar183._12_4_;
        auVar49._16_4_ = auVar183._16_4_ * auVar183._16_4_;
        auVar49._20_4_ = auVar183._20_4_ * auVar183._20_4_;
        auVar49._24_4_ = auVar183._24_4_ * auVar183._24_4_;
        auVar49._28_4_ = auVar183._28_4_;
        auVar118 = vsubps_avx(auVar12,auVar49);
        auVar50._4_4_ = auVar118._4_4_ * fVar214 * 4.0;
        auVar50._0_4_ = auVar118._0_4_ * fVar230 * 4.0;
        auVar50._8_4_ = auVar118._8_4_ * fVar292 * 4.0;
        auVar50._12_4_ = auVar118._12_4_ * fVar215 * 4.0;
        auVar50._16_4_ = auVar118._16_4_ * fVar216 * 4.0;
        auVar50._20_4_ = auVar118._20_4_ * fVar249 * 4.0;
        auVar50._24_4_ = auVar118._24_4_ * fVar262 * 4.0;
        auVar50._28_4_ = auVar183._28_4_;
        auVar12 = vsubps_avx(auVar35,auVar50);
        auVar183 = vcmpps_avx(auVar12,ZEXT1232(auVar57) << 0x20,5);
        if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar183 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar183 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar183 >> 0x7f,0) == '\0') &&
              (auVar183 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar183 >> 0xbf,0) == '\0') &&
            (auVar183 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar183[0x1f]) {
          auVar126 = SUB6432(ZEXT864(0),0) << 0x20;
          local_900 = ZEXT832(0) << 0x20;
          _local_820 = ZEXT832(0) << 0x20;
          auVar150 = ZEXT832(0) << 0x40;
          auVar242._8_4_ = 0x7f800000;
          auVar242._0_8_ = 0x7f8000007f800000;
          auVar242._12_4_ = 0x7f800000;
          auVar242._16_4_ = 0x7f800000;
          auVar242._20_4_ = 0x7f800000;
          auVar242._24_4_ = 0x7f800000;
          auVar242._28_4_ = 0x7f800000;
          auVar256._8_4_ = 0xff800000;
          auVar256._0_8_ = 0xff800000ff800000;
          auVar256._12_4_ = 0xff800000;
          auVar256._16_4_ = 0xff800000;
          auVar256._20_4_ = 0xff800000;
          auVar256._24_4_ = 0xff800000;
          auVar256._28_4_ = 0xff800000;
          auVar280 = local_9a0;
          local_8e0 = local_900;
        }
        else {
          auVar126 = vsqrtps_avx(auVar12);
          auVar257._0_4_ = fVar230 + fVar230;
          auVar257._4_4_ = fVar214 + fVar214;
          auVar257._8_4_ = fVar292 + fVar292;
          auVar257._12_4_ = fVar215 + fVar215;
          auVar257._16_4_ = fVar216 + fVar216;
          auVar257._20_4_ = fVar249 + fVar249;
          auVar257._24_4_ = fVar262 + fVar262;
          auVar257._28_4_ = fVar203 + fVar203;
          auVar121 = vrcpps_avx(auVar257);
          auVar104 = vfnmadd213ps_fma(auVar257,auVar121,auVar226);
          auVar104 = vfmadd132ps_fma(ZEXT1632(auVar104),auVar121,auVar121);
          auVar279._0_8_ = auVar253._0_8_ ^ 0x8000000080000000;
          auVar279._8_4_ = -auVar253._8_4_;
          auVar279._12_4_ = -auVar253._12_4_;
          auVar279._16_4_ = -auVar253._16_4_;
          auVar279._20_4_ = -auVar253._20_4_;
          auVar279._24_4_ = -auVar253._24_4_;
          auVar279._28_4_ = -auVar253._28_4_;
          auVar121 = vsubps_avx(auVar279,auVar126);
          auVar16 = vsubps_avx(auVar126,auVar253);
          fVar235 = auVar121._0_4_ * auVar104._0_4_;
          fVar245 = auVar121._4_4_ * auVar104._4_4_;
          auVar51._4_4_ = fVar245;
          auVar51._0_4_ = fVar235;
          fVar248 = auVar121._8_4_ * auVar104._8_4_;
          auVar51._8_4_ = fVar248;
          fVar217 = auVar121._12_4_ * auVar104._12_4_;
          auVar51._12_4_ = fVar217;
          fVar229 = auVar121._16_4_ * 0.0;
          auVar51._16_4_ = fVar229;
          fVar230 = auVar121._20_4_ * 0.0;
          auVar51._20_4_ = fVar230;
          fVar231 = auVar121._24_4_ * 0.0;
          auVar51._24_4_ = fVar231;
          auVar51._28_4_ = auVar126._28_4_;
          fVar232 = auVar104._0_4_ * auVar16._0_4_;
          fVar233 = auVar104._4_4_ * auVar16._4_4_;
          auVar280._4_4_ = fVar233;
          auVar280._0_4_ = fVar232;
          fVar214 = auVar104._8_4_ * auVar16._8_4_;
          auVar280._8_4_ = fVar214;
          fVar292 = auVar104._12_4_ * auVar16._12_4_;
          auVar280._12_4_ = fVar292;
          fVar215 = auVar16._16_4_ * 0.0;
          auVar280._16_4_ = fVar215;
          fVar216 = auVar16._20_4_ * 0.0;
          auVar280._20_4_ = fVar216;
          fVar249 = auVar16._24_4_ * 0.0;
          auVar280._24_4_ = fVar249;
          auVar280._28_4_ = auVar121._28_4_;
          auVar104 = vfmadd213ps_fma(auVar275,auVar51,auVar297);
          auVar103 = vfmadd213ps_fma(auVar275,auVar280,auVar297);
          auVar126 = ZEXT1632(CONCAT412(fVar228 * auVar104._12_4_,
                                        CONCAT48(fVar247 * auVar104._8_4_,
                                                 CONCAT44(fVar244 * auVar104._4_4_,
                                                          fVar100 * auVar104._0_4_))));
          auVar121 = ZEXT1632(CONCAT412(fVar228 * auVar103._12_4_,
                                        CONCAT48(fVar247 * auVar103._8_4_,
                                                 CONCAT44(fVar244 * auVar103._4_4_,
                                                          fVar100 * auVar103._0_4_))));
          auVar104 = vfmadd213ps_fma(auVar14,auVar126,auVar174);
          auVar103 = vfmadd213ps_fma(auVar14,auVar121,auVar174);
          auVar160 = vfmadd213ps_fma(local_240,auVar126,auVar147);
          auVar137 = vfmadd213ps_fma(local_240,auVar121,auVar147);
          auVar102 = vfmadd213ps_fma(auVar126,auVar15,auVar295);
          auVar138 = vfmadd213ps_fma(auVar15,auVar121,auVar295);
          auVar52._4_4_ = (float)local_880._4_4_ * fVar245;
          auVar52._0_4_ = (float)local_880._0_4_ * fVar235;
          auVar52._8_4_ = fStack_878 * fVar248;
          auVar52._12_4_ = fStack_874 * fVar217;
          auVar52._16_4_ = fStack_870 * fVar229;
          auVar52._20_4_ = fStack_86c * fVar230;
          auVar52._24_4_ = fStack_868 * fVar231;
          auVar52._28_4_ = 0;
          auVar126 = vsubps_avx(auVar52,ZEXT1632(auVar104));
          auVar53._4_4_ = (float)local_a60._4_4_ * fVar245;
          auVar53._0_4_ = (float)local_a60._0_4_ * fVar235;
          auVar53._8_4_ = fStack_a58 * fVar248;
          auVar53._12_4_ = fStack_a54 * fVar217;
          auVar53._16_4_ = fStack_a50 * fVar229;
          auVar53._20_4_ = fStack_a4c * fVar230;
          auVar53._24_4_ = fStack_a48 * fVar231;
          auVar53._28_4_ = fVar203;
          auVar150 = vsubps_avx(auVar53,ZEXT1632(auVar160));
          auVar178._0_4_ = fVar98 * fVar235;
          auVar178._4_4_ = fVar98 * fVar245;
          auVar178._8_4_ = fVar98 * fVar248;
          auVar178._12_4_ = fVar98 * fVar217;
          auVar178._16_4_ = fVar98 * fVar229;
          auVar178._20_4_ = fVar98 * fVar230;
          auVar178._24_4_ = fVar98 * fVar231;
          auVar178._28_4_ = 0;
          auVar15 = vsubps_avx(auVar178,ZEXT1632(auVar102));
          auVar291 = ZEXT3264(auVar15);
          auVar258._0_4_ = (float)local_880._0_4_ * fVar232;
          auVar258._4_4_ = (float)local_880._4_4_ * fVar233;
          auVar258._8_4_ = fStack_878 * fVar214;
          auVar258._12_4_ = fStack_874 * fVar292;
          auVar258._16_4_ = fStack_870 * fVar215;
          auVar258._20_4_ = fStack_86c * fVar216;
          auVar258._24_4_ = fStack_868 * fVar249;
          auVar258._28_4_ = 0;
          local_8e0 = vsubps_avx(auVar258,ZEXT1632(auVar103));
          auVar54._4_4_ = (float)local_a60._4_4_ * fVar233;
          auVar54._0_4_ = (float)local_a60._0_4_ * fVar232;
          auVar54._8_4_ = fStack_a58 * fVar214;
          auVar54._12_4_ = fStack_a54 * fVar292;
          auVar54._16_4_ = fStack_a50 * fVar215;
          auVar54._20_4_ = fStack_a4c * fVar216;
          auVar54._24_4_ = fStack_a48 * fVar249;
          auVar54._28_4_ = local_8e0._28_4_;
          local_900 = vsubps_avx(auVar54,ZEXT1632(auVar137));
          auVar55._4_4_ = fVar98 * fVar233;
          auVar55._0_4_ = fVar98 * fVar232;
          auVar55._8_4_ = fVar98 * fVar214;
          auVar55._12_4_ = fVar98 * fVar292;
          auVar55._16_4_ = fVar98 * fVar215;
          auVar55._20_4_ = fVar98 * fVar216;
          auVar55._24_4_ = fVar98 * fVar249;
          auVar55._28_4_ = local_900._28_4_;
          _local_820 = vsubps_avx(auVar55,ZEXT1632(auVar138));
          auVar276 = ZEXT864(0) << 0x20;
          auVar15 = vcmpps_avx(auVar12,_DAT_01faff00,5);
          auVar259._8_4_ = 0x7f800000;
          auVar259._0_8_ = 0x7f8000007f800000;
          auVar259._12_4_ = 0x7f800000;
          auVar259._16_4_ = 0x7f800000;
          auVar259._20_4_ = 0x7f800000;
          auVar259._24_4_ = 0x7f800000;
          auVar259._28_4_ = 0x7f800000;
          auVar242 = vblendvps_avx(auVar259,auVar51,auVar15);
          auVar60._4_4_ = uStack_8bc;
          auVar60._0_4_ = local_8c0;
          auVar60._8_4_ = uStack_8b8;
          auVar60._12_4_ = uStack_8b4;
          auVar60._16_4_ = uStack_8b0;
          auVar60._20_4_ = uStack_8ac;
          auVar60._24_4_ = uStack_8a8;
          auVar60._28_4_ = uStack_8a4;
          auVar12 = vandps_avx(auVar60,auVar34);
          auVar12 = vmaxps_avx(local_640,auVar12);
          auVar56._4_4_ = auVar12._4_4_ * 1.9073486e-06;
          auVar56._0_4_ = auVar12._0_4_ * 1.9073486e-06;
          auVar56._8_4_ = auVar12._8_4_ * 1.9073486e-06;
          auVar56._12_4_ = auVar12._12_4_ * 1.9073486e-06;
          auVar56._16_4_ = auVar12._16_4_ * 1.9073486e-06;
          auVar56._20_4_ = auVar12._20_4_ * 1.9073486e-06;
          auVar56._24_4_ = auVar12._24_4_ * 1.9073486e-06;
          auVar56._28_4_ = auVar12._28_4_;
          auVar12 = vandps_avx(auVar60,local_6a0);
          auVar12 = vcmpps_avx(auVar12,auVar56,1);
          auVar260._8_4_ = 0xff800000;
          auVar260._0_8_ = 0xff800000ff800000;
          auVar260._12_4_ = 0xff800000;
          auVar260._16_4_ = 0xff800000;
          auVar260._20_4_ = 0xff800000;
          auVar260._24_4_ = 0xff800000;
          auVar260._28_4_ = 0xff800000;
          auVar256 = vblendvps_avx(auVar260,auVar280,auVar15);
          auVar121 = auVar15 & auVar12;
          if ((((((((auVar121 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                   (auVar121 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                  (auVar121 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                 SUB321(auVar121 >> 0x7f,0) != '\0') ||
                (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
               SUB321(auVar121 >> 0xbf,0) != '\0') ||
              (auVar121 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
              auVar121[0x1f] < '\0') {
            auVar183 = vandps_avx(auVar12,auVar15);
            auVar12 = vcmpps_avx(auVar118,ZEXT832(0) << 0x20,2);
            auVar280._8_4_ = 0xff800000;
            auVar280._0_8_ = 0xff800000ff800000;
            auVar280._12_4_ = 0xff800000;
            auVar280._16_4_ = 0xff800000;
            auVar280._20_4_ = 0xff800000;
            auVar280._24_4_ = 0xff800000;
            auVar280._28_4_ = 0xff800000;
            auVar290._8_4_ = 0x7f800000;
            auVar290._0_8_ = 0x7f8000007f800000;
            auVar290._12_4_ = 0x7f800000;
            auVar290._16_4_ = 0x7f800000;
            auVar290._20_4_ = 0x7f800000;
            auVar290._24_4_ = 0x7f800000;
            auVar290._28_4_ = 0x7f800000;
            auVar118 = vblendvps_avx(auVar290,auVar280,auVar12);
            auVar104 = vpackssdw_avx(auVar183._0_16_,auVar183._16_16_);
            auVar121 = vpmovsxwd_avx2(auVar104);
            auVar242 = vblendvps_avx(auVar242,auVar118,auVar121);
            auVar118 = vblendvps_avx(auVar280,auVar290,auVar12);
            auVar276 = ZEXT3264(auVar118);
            auVar256 = vblendvps_avx(auVar256,auVar118,auVar121);
            auVar227._0_8_ = auVar183._0_8_ ^ 0xffffffffffffffff;
            auVar227._8_4_ = auVar183._8_4_ ^ 0xffffffff;
            auVar227._12_4_ = auVar183._12_4_ ^ 0xffffffff;
            auVar227._16_4_ = auVar183._16_4_ ^ 0xffffffff;
            auVar227._20_4_ = auVar183._20_4_ ^ 0xffffffff;
            auVar227._24_4_ = auVar183._24_4_ ^ 0xffffffff;
            auVar227._28_4_ = auVar183._28_4_ ^ 0xffffffff;
            auVar183 = vorps_avx(auVar12,auVar227);
            auVar183 = vandps_avx(auVar15,auVar183);
          }
        }
        auVar281 = ZEXT3264(auVar280);
        auVar267 = ZEXT3264(local_9c0);
        local_480 = local_9c0;
        local_460 = vminps_avx(local_300,auVar242);
        auVar121 = vmaxps_avx(local_9c0,auVar256);
        local_320 = auVar121;
        auVar118 = vcmpps_avx(local_9c0,local_460,2);
        local_760 = vandps_avx(auVar118,auVar117);
        auVar118 = vcmpps_avx(auVar121,local_300,2);
        local_7e0 = vandps_avx(auVar118,auVar117);
        auVar261 = ZEXT3264(local_7e0);
        auVar117 = vorps_avx(local_7e0,local_760);
        auVar16 = auVar272;
        if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar117 >> 0x7f,0) == '\0') &&
              (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar117 >> 0xbf,0) == '\0') &&
            (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar117[0x1f]) goto LAB_01611559;
        local_7a0._0_8_ = auVar183._0_8_ ^ 0xffffffffffffffff;
        local_7a0._8_4_ = auVar183._8_4_ ^ 0xffffffff;
        local_7a0._12_4_ = auVar183._12_4_ ^ 0xffffffff;
        local_7a0._16_4_ = auVar183._16_4_ ^ 0xffffffff;
        local_7a0._20_4_ = auVar183._20_4_ ^ 0xffffffff;
        local_7a0._24_4_ = auVar183._24_4_ ^ 0xffffffff;
        local_7a0._28_4_ = auVar183._28_4_ ^ 0xffffffff;
        auVar185._0_4_ = fVar98 * auVar291._0_4_;
        auVar185._4_4_ = fVar98 * auVar291._4_4_;
        auVar185._8_4_ = fVar98 * auVar291._8_4_;
        auVar185._12_4_ = fVar98 * auVar291._12_4_;
        auVar185._16_4_ = fVar98 * auVar291._16_4_;
        auVar185._20_4_ = fVar98 * auVar291._20_4_;
        auVar185._28_36_ = auVar291._28_36_;
        auVar185._24_4_ = fVar98 * auVar291._24_4_;
        auVar104 = vfmadd213ps_fma(auVar150,_local_a60,auVar185._0_32_);
        auVar104 = vfmadd213ps_fma(auVar126,_local_880,ZEXT1632(auVar104));
        auVar61._4_4_ = uStack_8bc;
        auVar61._0_4_ = local_8c0;
        auVar61._8_4_ = uStack_8b8;
        auVar61._12_4_ = uStack_8b4;
        auVar61._16_4_ = uStack_8b0;
        auVar61._20_4_ = uStack_8ac;
        auVar61._24_4_ = uStack_8a8;
        auVar61._28_4_ = uStack_8a4;
        auVar117 = vandps_avx(ZEXT1632(auVar104),auVar61);
        auVar153._8_4_ = 0x3e99999a;
        auVar153._0_8_ = 0x3e99999a3e99999a;
        auVar153._12_4_ = 0x3e99999a;
        auVar153._16_4_ = 0x3e99999a;
        auVar153._20_4_ = 0x3e99999a;
        auVar153._24_4_ = 0x3e99999a;
        auVar153._28_4_ = 0x3e99999a;
        auVar117 = vcmpps_avx(auVar117,auVar153,1);
        auVar117 = vorps_avx(auVar117,local_7a0);
        auVar154._8_4_ = 3;
        auVar154._0_8_ = 0x300000003;
        auVar154._12_4_ = 3;
        auVar154._16_4_ = 3;
        auVar154._20_4_ = 3;
        auVar154._24_4_ = 3;
        auVar154._28_4_ = 3;
        auVar179._8_4_ = 2;
        auVar179._0_8_ = 0x200000002;
        auVar179._12_4_ = 2;
        auVar179._16_4_ = 2;
        auVar179._20_4_ = 2;
        auVar179._24_4_ = 2;
        auVar179._28_4_ = 2;
        auVar117 = vblendvps_avx(auVar179,auVar154,auVar117);
        local_7c0._4_4_ = local_ca8;
        local_7c0._0_4_ = local_ca8;
        local_7c0._8_4_ = local_ca8;
        local_7c0._12_4_ = local_ca8;
        local_7c0._16_4_ = local_ca8;
        local_7c0._20_4_ = local_ca8;
        local_7c0._24_4_ = local_ca8;
        local_7c0._28_4_ = local_ca8;
        local_780 = vpcmpgtd_avx2(auVar117,local_7c0);
        local_720 = vpandn_avx2(local_780,local_760);
        auVar158 = ZEXT3264(local_720);
        auVar117 = local_760 & ~local_780;
        fStack_b7c = auVar7._4_4_;
        fStack_b78 = auVar7._8_4_;
        fStack_b74 = auVar7._12_4_;
        if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) == (undefined1  [32])0x0 &&
                 (auVar117 >> 0x3f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
                (auVar117 >> 0x5f & (undefined1  [32])0x1) == (undefined1  [32])0x0) &&
               SUB321(auVar117 >> 0x7f,0) == '\0') &&
              (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
             SUB321(auVar117 >> 0xbf,0) == '\0') &&
            (auVar117 & (undefined1  [32])0x100000000) == (undefined1  [32])0x0) &&
            -1 < auVar117[0x1f]) {
          auVar130._4_4_ = fVar246;
          auVar130._0_4_ = fVar246;
          auVar130._8_4_ = fVar246;
          auVar130._12_4_ = fVar246;
          auVar130._16_4_ = fVar246;
          auVar130._20_4_ = fVar246;
          auVar130._24_4_ = fVar246;
          auVar130._28_4_ = fVar246;
          local_7e0 = auVar14;
          local_860._16_16_ = local_860._16_16_;
        }
        else {
          auVar103 = vminps_avx(auVar8,auVar10);
          auVar104 = vmaxps_avx(auVar8,auVar10);
          auVar160 = vminps_avx(auVar9,auVar7);
          auVar137 = vminps_avx(auVar103,auVar160);
          auVar103 = vmaxps_avx(auVar9,auVar7);
          auVar160 = vmaxps_avx(auVar104,auVar103);
          auVar104 = vandps_avx(auVar137,auVar236);
          auVar103 = vandps_avx(auVar160,auVar236);
          auVar104 = vmaxps_avx(auVar104,auVar103);
          auVar103 = vmovshdup_avx(auVar104);
          auVar103 = vmaxss_avx(auVar103,auVar104);
          auVar104 = vshufpd_avx(auVar104,auVar104,1);
          auVar104 = vmaxss_avx(auVar104,auVar103);
          fVar203 = auVar104._0_4_ * 1.9073486e-06;
          auVar104 = vshufps_avx(auVar160,auVar160,0xff);
          local_8a0._4_4_ = local_9c0._4_4_ + (float)local_980._4_4_;
          local_8a0._0_4_ = local_9c0._0_4_ + (float)local_980._0_4_;
          fStack_898 = local_9c0._8_4_ + fStack_978;
          fStack_894 = local_9c0._12_4_ + fStack_974;
          fStack_890 = local_9c0._16_4_ + fStack_970;
          fStack_88c = local_9c0._20_4_ + fStack_96c;
          fStack_888 = local_9c0._24_4_ + fStack_968;
          fStack_884 = local_9c0._28_4_ + fStack_964;
          do {
            auVar131._8_4_ = 0x7f800000;
            auVar131._0_8_ = 0x7f8000007f800000;
            auVar131._12_4_ = 0x7f800000;
            auVar131._16_4_ = 0x7f800000;
            auVar131._20_4_ = 0x7f800000;
            auVar131._24_4_ = 0x7f800000;
            auVar131._28_4_ = 0x7f800000;
            auVar117 = auVar158._0_32_;
            auVar183 = vblendvps_avx(auVar131,local_9c0,auVar117);
            auVar118 = vshufps_avx(auVar183,auVar183,0xb1);
            auVar118 = vminps_avx(auVar183,auVar118);
            auVar12 = vshufpd_avx(auVar118,auVar118,5);
            auVar118 = vminps_avx(auVar118,auVar12);
            auVar12 = vpermpd_avx2(auVar118,0x4e);
            auVar118 = vminps_avx(auVar118,auVar12);
            auVar183 = vcmpps_avx(auVar183,auVar118,0);
            auVar118 = auVar117 & auVar183;
            if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar118 >> 0x7f,0) != '\0') ||
                  (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar118 >> 0xbf,0) != '\0') ||
                (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar118[0x1f] < '\0') {
              auVar117 = vandps_avx(auVar183,auVar117);
            }
            uVar91 = vmovmskps_avx(auVar117);
            iVar20 = 0;
            for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            uVar92 = iVar20 << 2;
            *(undefined4 *)(local_720 + uVar92) = 0;
            uVar91 = *(uint *)(local_1a0 + uVar92);
            uVar92 = *(uint *)(local_480 + uVar92);
            fVar100 = auVar5._0_4_;
            if ((float)local_9e0._0_4_ < 0.0) {
              fVar100 = sqrtf((float)local_9e0._0_4_);
            }
            local_a20._0_4_ = fVar100 * 1.9073486e-06;
            auVar103 = vinsertps_avx(ZEXT416(uVar92),ZEXT416(uVar91),0x10);
            auVar267 = ZEXT1664(auVar103);
            bVar97 = true;
            uVar93 = 0;
            do {
              fVar247 = auVar267._0_4_;
              auVar106._4_4_ = fVar247;
              auVar106._0_4_ = fVar247;
              auVar106._8_4_ = fVar247;
              auVar106._12_4_ = fVar247;
              auVar137 = vfmadd213ps_fma(auVar106,local_9d0,_DAT_01f7aa10);
              auVar160 = vmovshdup_avx(auVar267._0_16_);
              fVar248 = auVar160._0_4_;
              fVar246 = 1.0 - fVar248;
              auVar107 = SUB6416(ZEXT464(0x40400000),0);
              auVar112 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar102 = vfmadd213ss_fma(auVar107,auVar160,auVar112);
              auVar103 = vfmadd213ss_fma(auVar102,ZEXT416((uint)(fVar248 * fVar248)),
                                         SUB6416(ZEXT464(0x40000000),0));
              auVar138 = vfmadd213ss_fma(auVar107,ZEXT416((uint)fVar246),auVar112);
              auVar138 = vfmadd213ss_fma(auVar138,ZEXT416((uint)(fVar246 * fVar246)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar100 = fVar246 * fVar246 * -fVar248 * 0.5;
              fVar235 = auVar103._0_4_ * 0.5;
              fVar244 = auVar138._0_4_ * 0.5;
              fVar245 = fVar248 * fVar248 * -fVar246 * 0.5;
              auVar186._0_4_ = fVar245 * fVar135;
              auVar186._4_4_ = fVar245 * fStack_b7c;
              auVar186._8_4_ = fVar245 * fStack_b78;
              auVar186._12_4_ = fVar245 * fStack_b74;
              auVar205._4_4_ = fVar244;
              auVar205._0_4_ = fVar244;
              auVar205._8_4_ = fVar244;
              auVar205._12_4_ = fVar244;
              auVar103 = vfmadd132ps_fma(auVar205,auVar186,auVar9);
              auVar161._4_4_ = fVar235;
              auVar161._0_4_ = fVar235;
              auVar161._8_4_ = fVar235;
              auVar161._12_4_ = fVar235;
              auVar103 = vfmadd132ps_fma(auVar161,auVar103,auVar10);
              auVar187._4_4_ = fVar100;
              auVar187._0_4_ = fVar100;
              auVar187._8_4_ = fVar100;
              auVar187._12_4_ = fVar100;
              auVar103 = vfmadd132ps_fma(auVar187,auVar103,auVar8);
              auVar112 = vfmadd231ss_fma(auVar112,auVar160,ZEXT416(0x41100000));
              auVar138 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar160,ZEXT416(0x40800000)
                                        );
              local_840._0_16_ = auVar103;
              auVar103 = vsubps_avx(auVar137,auVar103);
              _local_960 = auVar103;
              auVar103 = vdpps_avx(auVar103,auVar103,0x7f);
              auVar137 = vfmadd213ss_fma(auVar107,auVar160,ZEXT416(0xbf800000));
              fVar100 = auVar103._0_4_;
              if (fVar100 < 0.0) {
                local_a00._0_4_ = auVar102._0_4_;
                local_a40._0_16_ = auVar112;
                local_9a0._0_4_ = fVar246 * -2.0;
                auVar291._0_4_ = sqrtf(fVar100);
                auVar291._4_60_ = extraout_var;
                auVar102 = ZEXT416((uint)local_a00._0_4_);
                auVar107 = auVar291._0_16_;
                fVar235 = (float)local_9a0._0_4_;
                auVar112 = local_a40._0_16_;
              }
              else {
                auVar107 = vsqrtss_avx(auVar103,auVar103);
                fVar235 = fVar246 * -2.0;
              }
              auVar101 = vfmadd213ss_fma(auVar102,ZEXT416((uint)(fVar248 + fVar248)),
                                         ZEXT416((uint)(fVar248 * fVar248 * 3.0)));
              auVar218 = SUB6416(ZEXT464(0x40000000),0);
              auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar160,auVar218);
              auVar136 = vfmadd231ss_fma(ZEXT416((uint)(fVar246 * fVar246 * -3.0)),
                                         ZEXT416((uint)(fVar246 + fVar246)),auVar102);
              auVar204 = vfnmadd231ss_fma(ZEXT416((uint)(fVar248 * (fVar246 + fVar246))),
                                          ZEXT416((uint)fVar246),ZEXT416((uint)fVar246));
              auVar102 = vfmadd213ss_fma(ZEXT416((uint)fVar235),auVar160,
                                         ZEXT416((uint)(fVar248 * fVar248)));
              fVar235 = auVar136._0_4_ * 0.5;
              fVar244 = auVar102._0_4_ * 0.5;
              auVar162._0_4_ = fVar135 * fVar244;
              auVar162._4_4_ = fStack_b7c * fVar244;
              auVar162._8_4_ = fStack_b78 * fVar244;
              auVar162._12_4_ = fStack_b74 * fVar244;
              auVar139._4_4_ = fVar235;
              auVar139._0_4_ = fVar235;
              auVar139._8_4_ = fVar235;
              auVar139._12_4_ = fVar235;
              auVar102 = vfmadd213ps_fma(auVar139,auVar9,auVar162);
              fVar235 = auVar204._0_4_ * 0.5;
              fVar244 = auVar101._0_4_ * 0.5;
              auVar163._4_4_ = fVar244;
              auVar163._0_4_ = fVar244;
              auVar163._8_4_ = fVar244;
              auVar163._12_4_ = fVar244;
              auVar102 = vfmadd213ps_fma(auVar163,auVar10,auVar102);
              auVar270._4_4_ = fVar235;
              auVar270._0_4_ = fVar235;
              auVar270._8_4_ = fVar235;
              auVar270._12_4_ = fVar235;
              auVar101 = vfmadd213ps_fma(auVar270,auVar8,auVar102);
              auVar102 = vfmadd213ss_fma(auVar160,SUB6416(ZEXT464(0xc0400000),0),auVar218);
              local_bc0 = auVar137._0_4_;
              auVar108._0_4_ = fVar135 * local_bc0;
              auVar108._4_4_ = fStack_b7c * local_bc0;
              auVar108._8_4_ = fStack_b78 * local_bc0;
              auVar108._12_4_ = fStack_b74 * local_bc0;
              local_b00 = auVar138._0_4_;
              auVar140._4_4_ = local_b00;
              auVar140._0_4_ = local_b00;
              auVar140._8_4_ = local_b00;
              auVar140._12_4_ = local_b00;
              auVar160 = vfmadd213ps_fma(auVar140,auVar9,auVar108);
              uVar99 = auVar112._0_4_;
              auVar164._4_4_ = uVar99;
              auVar164._0_4_ = uVar99;
              auVar164._8_4_ = uVar99;
              auVar164._12_4_ = uVar99;
              auVar160 = vfmadd213ps_fma(auVar164,auVar10,auVar160);
              auVar137 = vdpps_avx(auVar101,auVar101,0x7f);
              uVar99 = auVar102._0_4_;
              auVar141._4_4_ = uVar99;
              auVar141._0_4_ = uVar99;
              auVar141._8_4_ = uVar99;
              auVar141._12_4_ = uVar99;
              auVar138 = vfmadd213ps_fma(auVar141,auVar8,auVar160);
              auVar160 = vblendps_avx(auVar137,_DAT_01f7aa10,0xe);
              auVar102 = vrsqrtss_avx(auVar160,auVar160);
              fVar245 = auVar137._0_4_;
              fVar235 = auVar102._0_4_;
              auVar102 = vdpps_avx(auVar101,auVar138,0x7f);
              fVar235 = fVar235 * 1.5 + fVar245 * -0.5 * fVar235 * fVar235 * fVar235;
              auVar142._0_4_ = auVar138._0_4_ * fVar245;
              auVar142._4_4_ = auVar138._4_4_ * fVar245;
              auVar142._8_4_ = auVar138._8_4_ * fVar245;
              auVar142._12_4_ = auVar138._12_4_ * fVar245;
              fVar244 = auVar102._0_4_;
              auVar222._0_4_ = auVar101._0_4_ * fVar244;
              auVar222._4_4_ = auVar101._4_4_ * fVar244;
              fVar246 = auVar101._8_4_;
              auVar222._8_4_ = fVar246 * fVar244;
              fVar248 = auVar101._12_4_;
              auVar222._12_4_ = fVar248 * fVar244;
              auVar102 = vsubps_avx(auVar142,auVar222);
              auVar160 = vrcpss_avx(auVar160,auVar160);
              auVar138 = vfnmadd213ss_fma(auVar160,auVar137,auVar218);
              fVar244 = auVar160._0_4_ * auVar138._0_4_;
              auVar160 = vmaxss_avx(ZEXT416((uint)fVar203),
                                    ZEXT416((uint)(fVar247 * (float)local_a20._0_4_)));
              auVar281 = ZEXT1664(auVar160);
              local_a00._0_8_ = auVar101._0_8_ ^ 0x8000000080000000;
              local_a00._8_4_ = -fVar246;
              local_a00._12_4_ = -fVar248;
              auVar188._0_4_ = fVar235 * auVar102._0_4_ * fVar244;
              auVar188._4_4_ = fVar235 * auVar102._4_4_ * fVar244;
              auVar188._8_4_ = fVar235 * auVar102._8_4_ * fVar244;
              auVar188._12_4_ = fVar235 * auVar102._12_4_ * fVar244;
              auVar238._0_4_ = auVar101._0_4_ * fVar235;
              auVar238._4_4_ = auVar101._4_4_ * fVar235;
              auVar238._8_4_ = fVar246 * fVar235;
              auVar238._12_4_ = fVar248 * fVar235;
              if (fVar245 < -fVar245) {
                fVar235 = sqrtf(fVar245);
                auVar281 = ZEXT464(auVar160._0_4_);
                auVar107 = ZEXT416(auVar107._0_4_);
              }
              else {
                auVar137 = vsqrtss_avx(auVar137,auVar137);
                fVar235 = auVar137._0_4_;
              }
              auVar137 = vdpps_avx(_local_960,auVar238,0x7f);
              auVar136 = vfmadd213ss_fma(ZEXT416((uint)fVar203),auVar107,auVar281._0_16_);
              auVar102 = vdpps_avx(local_a00._0_16_,auVar238,0x7f);
              auVar138 = vdpps_avx(_local_960,auVar188,0x7f);
              auVar112 = vdpps_avx(local_9d0,auVar238,0x7f);
              auVar136 = vfmadd213ss_fma(ZEXT416((uint)(auVar107._0_4_ + 1.0)),
                                         ZEXT416((uint)(fVar203 / fVar235)),auVar136);
              auVar276 = ZEXT1664(auVar136);
              fVar235 = auVar102._0_4_ + auVar138._0_4_;
              fVar245 = auVar137._0_4_;
              auVar109._0_4_ = fVar245 * fVar245;
              auVar109._4_4_ = auVar137._4_4_ * auVar137._4_4_;
              auVar109._8_4_ = auVar137._8_4_ * auVar137._8_4_;
              auVar109._12_4_ = auVar137._12_4_ * auVar137._12_4_;
              auVar102 = vdpps_avx(_local_960,local_a00._0_16_,0x7f);
              auVar107 = vsubps_avx(auVar103,auVar109);
              auVar138 = vrsqrtss_avx(auVar107,auVar107);
              fVar246 = auVar107._0_4_;
              fVar244 = auVar138._0_4_;
              fVar244 = fVar244 * 1.5 + fVar246 * -0.5 * fVar244 * fVar244 * fVar244;
              auVar138 = vdpps_avx(_local_960,local_9d0,0x7f);
              local_a00._0_16_ = vfnmadd231ss_fma(auVar102,auVar137,ZEXT416((uint)fVar235));
              auVar102 = vfnmadd231ss_fma(auVar138,auVar137,auVar112);
              if (fVar246 < 0.0) {
                local_a40._0_16_ = ZEXT416((uint)fVar235);
                local_9a0._0_4_ = fVar244;
                local_860._0_16_ = auVar102;
                fVar246 = sqrtf(fVar246);
                auVar276 = ZEXT464(auVar136._0_4_);
                auVar281 = ZEXT464(auVar160._0_4_);
                fVar244 = (float)local_9a0._0_4_;
                auVar102 = local_860._0_16_;
                auVar160 = local_a40._0_16_;
              }
              else {
                auVar160 = vsqrtss_avx(auVar107,auVar107);
                fVar246 = auVar160._0_4_;
                auVar160 = ZEXT416((uint)fVar235);
              }
              auVar138 = vpermilps_avx(local_840._0_16_,0xff);
              fVar246 = fVar246 - auVar138._0_4_;
              auVar138 = vshufps_avx(auVar101,auVar101,0xff);
              auVar107 = vfmsub213ss_fma(local_a00._0_16_,ZEXT416((uint)fVar244),auVar138);
              auVar189._0_8_ = auVar112._0_8_ ^ 0x8000000080000000;
              auVar189._8_4_ = auVar112._8_4_ ^ 0x80000000;
              auVar189._12_4_ = auVar112._12_4_ ^ 0x80000000;
              auVar206._0_8_ = auVar107._0_8_ ^ 0x8000000080000000;
              auVar206._8_4_ = auVar107._8_4_ ^ 0x80000000;
              auVar206._12_4_ = auVar107._12_4_ ^ 0x80000000;
              auVar102 = ZEXT416((uint)(auVar102._0_4_ * fVar244));
              auVar112 = vfmsub231ss_fma(ZEXT416((uint)(auVar107._0_4_ * auVar112._0_4_)),auVar160,
                                         auVar102);
              auVar102 = vinsertps_avx(auVar206,auVar102,0x1c);
              uVar99 = auVar112._0_4_;
              auVar207._4_4_ = uVar99;
              auVar207._0_4_ = uVar99;
              auVar207._8_4_ = uVar99;
              auVar207._12_4_ = uVar99;
              auVar102 = vdivps_avx(auVar102,auVar207);
              auVar160 = vinsertps_avx(auVar160,auVar189,0x10);
              auVar160 = vdivps_avx(auVar160,auVar207);
              auVar165._0_4_ = fVar245 * auVar102._0_4_ + fVar246 * auVar160._0_4_;
              auVar165._4_4_ = fVar245 * auVar102._4_4_ + fVar246 * auVar160._4_4_;
              auVar165._8_4_ = fVar245 * auVar102._8_4_ + fVar246 * auVar160._8_4_;
              auVar165._12_4_ = fVar245 * auVar102._12_4_ + fVar246 * auVar160._12_4_;
              auVar102 = vsubps_avx(auVar267._0_16_,auVar165);
              auVar267 = ZEXT1664(auVar102);
              auVar160 = vandps_avx(auVar137,auVar236);
              if (auVar160._0_4_ < auVar276._0_4_) {
                auVar137 = vfmadd231ss_fma(ZEXT416((uint)(auVar281._0_4_ + auVar276._0_4_)),auVar104
                                           ,ZEXT416(0x36000000));
                auVar160 = vandps_avx(ZEXT416((uint)fVar246),auVar236);
                if (auVar160._0_4_ < auVar137._0_4_) {
                  fVar235 = auVar102._0_4_ + (float)local_920._0_4_;
                  if (fVar235 < fVar134) {
                    bVar87 = 0;
                    goto LAB_01611ef4;
                  }
                  fVar244 = *(float *)(ray + k * 4 + 0x100);
                  auVar276 = ZEXT464((uint)fVar244);
                  if (fVar235 <= fVar244) {
                    auVar160 = vmovshdup_avx(auVar102);
                    bVar87 = 0;
                    if ((auVar160._0_4_ < 0.0) || (1.0 < auVar160._0_4_)) goto LAB_01611ef4;
                    auVar103 = vrsqrtss_avx(auVar103,auVar103);
                    fVar245 = auVar103._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar88].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      bVar87 = 0;
                      goto LAB_01611ef4;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar87 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01611ef4;
                    fVar100 = fVar245 * 1.5 + fVar100 * -0.5 * fVar245 * fVar245 * fVar245;
                    auVar190._0_4_ = fVar100 * (float)local_960._0_4_;
                    auVar190._4_4_ = fVar100 * (float)local_960._4_4_;
                    auVar190._8_4_ = fVar100 * fStack_958;
                    auVar190._12_4_ = fVar100 * fStack_954;
                    auVar112 = vfmadd213ps_fma(auVar138,auVar190,auVar101);
                    auVar103 = vshufps_avx(auVar190,auVar190,0xc9);
                    auVar137 = vshufps_avx(auVar101,auVar101,0xc9);
                    auVar191._0_4_ = auVar190._0_4_ * auVar137._0_4_;
                    auVar191._4_4_ = auVar190._4_4_ * auVar137._4_4_;
                    auVar191._8_4_ = auVar190._8_4_ * auVar137._8_4_;
                    auVar191._12_4_ = auVar190._12_4_ * auVar137._12_4_;
                    auVar138 = vfmsub231ps_fma(auVar191,auVar101,auVar103);
                    auVar103 = vshufps_avx(auVar138,auVar138,0xc9);
                    auVar137 = vshufps_avx(auVar112,auVar112,0xc9);
                    auVar138 = vshufps_avx(auVar138,auVar138,0xd2);
                    auVar110._0_4_ = auVar112._0_4_ * auVar138._0_4_;
                    auVar110._4_4_ = auVar112._4_4_ * auVar138._4_4_;
                    auVar110._8_4_ = auVar112._8_4_ * auVar138._8_4_;
                    auVar110._12_4_ = auVar112._12_4_ * auVar138._12_4_;
                    auVar137 = vfmsub231ps_fma(auVar110,auVar103,auVar137);
                    local_3e0 = auVar160._0_8_;
                    auVar103 = vmovshdup_avx(auVar137);
                    local_440._8_8_ = auVar103._0_8_;
                    auVar103 = vshufps_avx(auVar137,auVar137,0xaa);
                    local_420 = auVar103._0_8_;
                    local_400 = auVar137._0_4_;
                    local_440._0_8_ = local_440._8_8_;
                    local_440._16_8_ = local_440._8_8_;
                    local_440._24_8_ = local_440._8_8_;
                    uStack_418 = local_420;
                    uStack_410 = local_420;
                    uStack_408 = local_420;
                    uStack_3fc = local_400;
                    uStack_3f8 = local_400;
                    uStack_3f4 = local_400;
                    uStack_3f0 = local_400;
                    uStack_3ec = local_400;
                    uStack_3e8 = local_400;
                    uStack_3e4 = local_400;
                    uStack_3d8 = local_3e0;
                    uStack_3d0 = local_3e0;
                    uStack_3c8 = local_3e0;
                    auVar166._12_4_ = 0;
                    auVar166._0_12_ = ZEXT812(0);
                    auVar166 = auVar166 << 0x20;
                    local_3c0 = ZEXT1232(ZEXT812(0)) << 0x20;
                    local_3a0 = CONCAT44(uStack_67c,local_680);
                    uStack_398 = CONCAT44(uStack_674,uStack_678);
                    uStack_390 = CONCAT44(uStack_66c,uStack_670);
                    uStack_388 = CONCAT44(uStack_664,uStack_668);
                    local_380._4_4_ = uStack_65c;
                    local_380._0_4_ = local_660;
                    local_380._8_4_ = uStack_658;
                    local_380._12_4_ = uStack_654;
                    local_380._16_4_ = uStack_650;
                    local_380._20_4_ = uStack_64c;
                    local_380._24_4_ = uStack_648;
                    local_380._28_4_ = uStack_644;
                    vpcmpeqd_avx2(local_380,local_380);
                    local_360 = context->user->instID[0];
                    uStack_35c = local_360;
                    uStack_358 = local_360;
                    uStack_354 = local_360;
                    uStack_350 = local_360;
                    uStack_34c = local_360;
                    uStack_348 = local_360;
                    uStack_344 = local_360;
                    local_340 = context->user->instPrimID[0];
                    uStack_33c = local_340;
                    uStack_338 = local_340;
                    uStack_334 = local_340;
                    uStack_330 = local_340;
                    uStack_32c = local_340;
                    uStack_328 = local_340;
                    uStack_324 = local_340;
                    *(float *)(ray + k * 4 + 0x100) = fVar235;
                    local_940 = local_6c0;
                    local_a90.valid = (int *)local_940;
                    local_a90.geometryUserPtr = pGVar3->userPtr;
                    local_a90.context = context->user;
                    local_a90.hit = (RTCHitN *)local_440;
                    local_a90.N = 8;
                    local_a90.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar267 = ZEXT1664(auVar102);
                      auVar281 = ZEXT1664(auVar281._0_16_);
                      (*pGVar3->occlusionFilterN)(&local_a90);
                      auVar166 = ZEXT816(0) << 0x40;
                    }
                    auVar183 = ZEXT1632(auVar166);
                    auVar117 = vpcmpeqd_avx2(local_940,auVar183);
                    auVar117 = _DAT_01fe9960 & ~auVar117;
                    if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar117 >> 0x7f,0) != '\0') ||
                          (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar117 >> 0xbf,0) != '\0') ||
                        (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar117[0x1f] < '\0') {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar267 = ZEXT1664(auVar267._0_16_);
                        auVar281 = ZEXT1664(auVar281._0_16_);
                        (*p_Var4)(&local_a90);
                        auVar183 = ZEXT832(0) << 0x40;
                      }
                      auVar276 = ZEXT464((uint)fVar244);
                      auVar183 = vpcmpeqd_avx2(local_940,auVar183);
                      auVar155._8_4_ = 0xff800000;
                      auVar155._0_8_ = 0xff800000ff800000;
                      auVar155._12_4_ = 0xff800000;
                      auVar155._16_4_ = 0xff800000;
                      auVar155._20_4_ = 0xff800000;
                      auVar155._24_4_ = 0xff800000;
                      auVar155._28_4_ = 0xff800000;
                      auVar117 = vblendvps_avx(auVar155,*(undefined1 (*) [32])
                                                         (local_a90.ray + 0x100),auVar183);
                      *(undefined1 (*) [32])(local_a90.ray + 0x100) = auVar117;
                      auVar117 = _DAT_01fe9960 & ~auVar183;
                      if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar117 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar117 >> 0x7f,0) != '\0') ||
                            (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar117 >> 0xbf,0) != '\0') ||
                          (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar117[0x1f] < '\0') {
                        bVar87 = 1;
                        goto LAB_01611ef4;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar244;
                  }
                  auVar276 = ZEXT464((uint)fVar244);
                  bVar87 = 0;
                  goto LAB_01611ef4;
                }
              }
              bVar97 = uVar93 < 4;
              uVar93 = uVar93 + 1;
            } while (uVar93 != 5);
            bVar97 = false;
            bVar87 = 5;
LAB_01611ef4:
            bVar96 = (bool)(bVar96 | bVar97 & bVar87);
            uVar99 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar130._4_4_ = uVar99;
            auVar130._0_4_ = uVar99;
            auVar130._8_4_ = uVar99;
            auVar130._12_4_ = uVar99;
            auVar130._16_4_ = uVar99;
            auVar130._20_4_ = uVar99;
            auVar130._24_4_ = uVar99;
            auVar130._28_4_ = uVar99;
            auVar183 = vcmpps_avx(_local_8a0,auVar130,2);
            auVar117 = vandps_avx(auVar183,local_720);
            auVar158 = ZEXT3264(auVar117);
            auVar183 = local_720 & auVar183;
            local_720 = auVar117;
          } while ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar183 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar183 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar183 >> 0x7f,0) != '\0') ||
                     (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar183 >> 0xbf,0) != '\0') ||
                   (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar183[0x1f] < '\0');
          auVar158 = ZEXT3264(local_320);
          auVar261 = ZEXT3264(local_7e0);
        }
        auVar118 = local_320;
        auVar243 = ZEXT3264(auVar121);
        auVar291 = ZEXT3264(auVar272);
        auVar159._0_4_ = fVar98 * (float)local_820._0_4_;
        auVar159._4_4_ = fVar98 * (float)local_820._4_4_;
        auVar159._8_4_ = fVar98 * fStack_818;
        auVar159._12_4_ = fVar98 * fStack_814;
        auVar159._16_4_ = fVar98 * fStack_810;
        auVar159._20_4_ = fVar98 * fStack_80c;
        auVar159._28_36_ = auVar158._28_36_;
        auVar159._24_4_ = fVar98 * fStack_808;
        auVar104 = vfmadd213ps_fma(local_900,_local_a60,auVar159._0_32_);
        auVar104 = vfmadd213ps_fma(local_8e0,_local_880,ZEXT1632(auVar104));
        auVar62._4_4_ = uStack_8bc;
        auVar62._0_4_ = local_8c0;
        auVar62._8_4_ = uStack_8b8;
        auVar62._12_4_ = uStack_8b4;
        auVar62._16_4_ = uStack_8b0;
        auVar62._20_4_ = uStack_8ac;
        auVar62._24_4_ = uStack_8a8;
        auVar62._28_4_ = uStack_8a4;
        auVar117 = vandps_avx(ZEXT1632(auVar104),auVar62);
        auVar180._8_4_ = 0x3e99999a;
        auVar180._0_8_ = 0x3e99999a3e99999a;
        auVar180._12_4_ = 0x3e99999a;
        auVar180._16_4_ = 0x3e99999a;
        auVar180._20_4_ = 0x3e99999a;
        auVar180._24_4_ = 0x3e99999a;
        auVar180._28_4_ = 0x3e99999a;
        auVar117 = vcmpps_avx(auVar117,auVar180,1);
        auVar183 = vorps_avx(auVar117,local_7a0);
        auVar181._0_4_ = (float)local_980._0_4_ + auVar121._0_4_;
        auVar181._4_4_ = (float)local_980._4_4_ + auVar121._4_4_;
        auVar181._8_4_ = fStack_978 + auVar121._8_4_;
        auVar181._12_4_ = fStack_974 + auVar121._12_4_;
        auVar181._16_4_ = fStack_970 + auVar121._16_4_;
        auVar181._20_4_ = fStack_96c + auVar121._20_4_;
        auVar181._24_4_ = fStack_968 + auVar121._24_4_;
        auVar181._28_4_ = fStack_964 + auVar121._28_4_;
        auVar117 = vcmpps_avx(auVar181,auVar130,2);
        local_8e0 = vandps_avx(auVar261._0_32_,auVar117);
        auVar182._8_4_ = 3;
        auVar182._0_8_ = 0x300000003;
        auVar182._12_4_ = 3;
        auVar182._16_4_ = 3;
        auVar182._20_4_ = 3;
        auVar182._24_4_ = 3;
        auVar182._28_4_ = 3;
        auVar201._8_4_ = 2;
        auVar201._0_8_ = 0x200000002;
        auVar201._12_4_ = 2;
        auVar201._16_4_ = 2;
        auVar201._20_4_ = 2;
        auVar201._24_4_ = 2;
        auVar201._28_4_ = 2;
        auVar117 = vblendvps_avx(auVar201,auVar182,auVar183);
        local_900 = vpcmpgtd_avx2(auVar117,local_7c0);
        auVar117 = vpandn_avx2(local_900,local_8e0);
        auVar183 = local_8e0 & ~local_900;
        local_740 = auVar117;
        if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar183 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar183 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar183 >> 0x7f,0) != '\0') ||
              (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar183 >> 0xbf,0) != '\0') ||
            (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar183[0x1f] < '\0') {
          auVar103 = vminps_avx(auVar8,auVar10);
          auVar104 = vmaxps_avx(auVar8,auVar10);
          auVar160 = vminps_avx(auVar9,auVar7);
          auVar137 = vminps_avx(auVar103,auVar160);
          auVar103 = vmaxps_avx(auVar9,auVar7);
          auVar160 = vmaxps_avx(auVar104,auVar103);
          auVar104 = vandps_avx(auVar137,auVar236);
          auVar103 = vandps_avx(auVar160,auVar236);
          auVar104 = vmaxps_avx(auVar104,auVar103);
          auVar103 = vmovshdup_avx(auVar104);
          auVar103 = vmaxss_avx(auVar103,auVar104);
          auVar104 = vshufpd_avx(auVar104,auVar104,1);
          auVar104 = vmaxss_avx(auVar104,auVar103);
          fVar203 = auVar104._0_4_ * 1.9073486e-06;
          local_860._0_16_ = vshufps_avx(auVar160,auVar160,0xff);
          local_8a0._4_4_ = (float)local_980._4_4_ + local_320._4_4_;
          local_8a0._0_4_ = (float)local_980._0_4_ + local_320._0_4_;
          fStack_898 = fStack_978 + local_320._8_4_;
          fStack_894 = fStack_974 + local_320._12_4_;
          fStack_890 = fStack_970 + local_320._16_4_;
          fStack_88c = fStack_96c + local_320._20_4_;
          fStack_888 = fStack_968 + local_320._24_4_;
          fStack_884 = fStack_964 + local_320._28_4_;
          do {
            auVar132._8_4_ = 0x7f800000;
            auVar132._0_8_ = 0x7f8000007f800000;
            auVar132._12_4_ = 0x7f800000;
            auVar132._16_4_ = 0x7f800000;
            auVar132._20_4_ = 0x7f800000;
            auVar132._24_4_ = 0x7f800000;
            auVar132._28_4_ = 0x7f800000;
            auVar183 = vblendvps_avx(auVar132,auVar118,auVar117);
            auVar12 = vshufps_avx(auVar183,auVar183,0xb1);
            auVar12 = vminps_avx(auVar183,auVar12);
            auVar14 = vshufpd_avx(auVar12,auVar12,5);
            auVar12 = vminps_avx(auVar12,auVar14);
            auVar14 = vpermpd_avx2(auVar12,0x4e);
            auVar12 = vminps_avx(auVar12,auVar14);
            auVar12 = vcmpps_avx(auVar183,auVar12,0);
            auVar14 = auVar117 & auVar12;
            auVar183 = auVar117;
            if ((((((((auVar14 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar14 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar14 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar14 >> 0x7f,0) != '\0') ||
                  (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar14 >> 0xbf,0) != '\0') ||
                (auVar14 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar14[0x1f] < '\0') {
              auVar183 = vandps_avx(auVar12,auVar117);
            }
            uVar91 = vmovmskps_avx(auVar183);
            iVar20 = 0;
            for (; (uVar91 & 1) == 0; uVar91 = uVar91 >> 1 | 0x80000000) {
              iVar20 = iVar20 + 1;
            }
            uVar92 = iVar20 << 2;
            local_740 = auVar117;
            *(undefined4 *)(local_740 + uVar92) = 0;
            uVar91 = *(uint *)(local_1c0 + uVar92);
            uVar92 = *(uint *)(local_300 + uVar92);
            fVar100 = auVar6._0_4_;
            if ((float)local_9e0._0_4_ < 0.0) {
              fVar100 = sqrtf((float)local_9e0._0_4_);
            }
            local_a00._0_4_ = fVar100 * 1.9073486e-06;
            auVar104 = vinsertps_avx(ZEXT416(uVar92),ZEXT416(uVar91),0x10);
            auVar267 = ZEXT1664(auVar104);
            bVar97 = true;
            uVar93 = 0;
            do {
              uVar99 = auVar267._0_4_;
              auVar111._4_4_ = uVar99;
              auVar111._0_4_ = uVar99;
              auVar111._8_4_ = uVar99;
              auVar111._12_4_ = uVar99;
              auVar160 = vfmadd213ps_fma(auVar111,local_9d0,_DAT_01f7aa10);
              auVar107 = auVar267._0_16_;
              auVar103 = vmovshdup_avx(auVar107);
              fVar247 = auVar103._0_4_;
              fVar246 = 1.0 - fVar247;
              auVar291 = ZEXT464((uint)fVar246);
              auVar112 = SUB6416(ZEXT464(0x40400000),0);
              auVar138 = SUB6416(ZEXT464(0xc0a00000),0);
              auVar137 = vfmadd213ss_fma(auVar112,auVar103,auVar138);
              auVar104 = vfmadd213ss_fma(auVar137,ZEXT416((uint)(fVar247 * fVar247)),
                                         SUB6416(ZEXT464(0x40000000),0));
              auVar102 = vfmadd213ss_fma(auVar112,ZEXT416((uint)fVar246),auVar138);
              auVar102 = vfmadd213ss_fma(auVar102,ZEXT416((uint)(fVar246 * fVar246)),
                                         SUB6416(ZEXT464(0x40000000),0));
              fVar100 = fVar246 * fVar246 * -fVar247 * 0.5;
              fVar235 = auVar104._0_4_ * 0.5;
              fVar244 = auVar102._0_4_ * 0.5;
              fVar245 = fVar247 * fVar247 * -fVar246 * 0.5;
              auVar192._0_4_ = fVar245 * fVar135;
              auVar192._4_4_ = fVar245 * fStack_b7c;
              auVar192._8_4_ = fVar245 * fStack_b78;
              auVar192._12_4_ = fVar245 * fStack_b74;
              auVar208._4_4_ = fVar244;
              auVar208._0_4_ = fVar244;
              auVar208._8_4_ = fVar244;
              auVar208._12_4_ = fVar244;
              auVar104 = vfmadd132ps_fma(auVar208,auVar192,auVar9);
              auVar167._4_4_ = fVar235;
              auVar167._0_4_ = fVar235;
              auVar167._8_4_ = fVar235;
              auVar167._12_4_ = fVar235;
              auVar104 = vfmadd132ps_fma(auVar167,auVar104,auVar10);
              auVar193._4_4_ = fVar100;
              auVar193._0_4_ = fVar100;
              auVar193._8_4_ = fVar100;
              auVar193._12_4_ = fVar100;
              auVar104 = vfmadd132ps_fma(auVar193,auVar104,auVar8);
              auVar138 = vfmadd231ss_fma(auVar138,auVar103,ZEXT416(0x41100000));
              auVar102 = vfmadd213ss_fma(SUB6416(ZEXT464(0xc1100000),0),auVar103,ZEXT416(0x40800000)
                                        );
              local_840._0_16_ = auVar104;
              auVar104 = vsubps_avx(auVar160,auVar104);
              _local_960 = auVar104;
              auVar104 = vdpps_avx(auVar104,auVar104,0x7f);
              auVar160 = vfmadd213ss_fma(auVar112,auVar103,ZEXT416(0xbf800000));
              fVar100 = auVar104._0_4_;
              if (fVar100 < 0.0) {
                local_a20._0_4_ = auVar137._0_4_;
                local_a40._0_4_ = fVar246 * -2.0;
                auVar261._0_4_ = sqrtf(fVar100);
                auVar261._4_60_ = extraout_var_00;
                auVar291 = ZEXT1664(ZEXT416((uint)fVar246));
                auVar137 = ZEXT416((uint)local_a20._0_4_);
                auVar267 = ZEXT1664(auVar107);
                auVar112 = auVar261._0_16_;
                fVar235 = (float)local_a40._0_4_;
              }
              else {
                auVar112 = vsqrtss_avx(auVar104,auVar104);
                fVar235 = fVar246 * -2.0;
              }
              fVar244 = auVar291._0_4_;
              auVar101 = vfmadd213ss_fma(auVar137,ZEXT416((uint)(fVar247 + fVar247)),
                                         ZEXT416((uint)(fVar247 * fVar247 * 3.0)));
              auVar218 = SUB6416(ZEXT464(0x40000000),0);
              auVar137 = vfmadd213ss_fma(SUB6416(ZEXT464(0x40400000),0),auVar103,auVar218);
              auVar136 = vfmadd231ss_fma(ZEXT416((uint)(fVar244 * fVar244 * -3.0)),
                                         ZEXT416((uint)(fVar244 + fVar244)),auVar137);
              auVar219 = auVar291._0_16_;
              auVar204 = vfnmadd231ss_fma(ZEXT416((uint)(fVar247 * (fVar244 + fVar244))),auVar219,
                                          auVar219);
              auVar137 = vfmadd213ss_fma(ZEXT416((uint)fVar235),auVar103,
                                         ZEXT416((uint)(fVar247 * fVar247)));
              fVar235 = auVar136._0_4_ * 0.5;
              fVar244 = auVar137._0_4_ * 0.5;
              auVar168._0_4_ = fVar135 * fVar244;
              auVar168._4_4_ = fStack_b7c * fVar244;
              auVar168._8_4_ = fStack_b78 * fVar244;
              auVar168._12_4_ = fStack_b74 * fVar244;
              auVar143._4_4_ = fVar235;
              auVar143._0_4_ = fVar235;
              auVar143._8_4_ = fVar235;
              auVar143._12_4_ = fVar235;
              auVar137 = vfmadd213ps_fma(auVar143,auVar9,auVar168);
              fVar235 = auVar204._0_4_ * 0.5;
              fVar244 = auVar101._0_4_ * 0.5;
              auVar169._4_4_ = fVar244;
              auVar169._0_4_ = fVar244;
              auVar169._8_4_ = fVar244;
              auVar169._12_4_ = fVar244;
              auVar137 = vfmadd213ps_fma(auVar169,auVar10,auVar137);
              auVar271._4_4_ = fVar235;
              auVar271._0_4_ = fVar235;
              auVar271._8_4_ = fVar235;
              auVar271._12_4_ = fVar235;
              auVar101 = vfmadd213ps_fma(auVar271,auVar8,auVar137);
              auVar137 = vfmadd213ss_fma(auVar103,SUB6416(ZEXT464(0xc0400000),0),auVar218);
              local_bc0 = auVar160._0_4_;
              auVar113._0_4_ = fVar135 * local_bc0;
              auVar113._4_4_ = fStack_b7c * local_bc0;
              auVar113._8_4_ = fStack_b78 * local_bc0;
              auVar113._12_4_ = fStack_b74 * local_bc0;
              local_b00 = auVar102._0_4_;
              auVar144._4_4_ = local_b00;
              auVar144._0_4_ = local_b00;
              auVar144._8_4_ = local_b00;
              auVar144._12_4_ = local_b00;
              auVar103 = vfmadd213ps_fma(auVar144,auVar9,auVar113);
              uVar99 = auVar138._0_4_;
              auVar170._4_4_ = uVar99;
              auVar170._0_4_ = uVar99;
              auVar170._8_4_ = uVar99;
              auVar170._12_4_ = uVar99;
              auVar103 = vfmadd213ps_fma(auVar170,auVar10,auVar103);
              auVar160 = vdpps_avx(auVar101,auVar101,0x7f);
              uVar99 = auVar137._0_4_;
              auVar145._4_4_ = uVar99;
              auVar145._0_4_ = uVar99;
              auVar145._8_4_ = uVar99;
              auVar145._12_4_ = uVar99;
              auVar102 = vfmadd213ps_fma(auVar145,auVar8,auVar103);
              auVar103 = vblendps_avx(auVar160,_DAT_01f7aa10,0xe);
              auVar137 = vrsqrtss_avx(auVar103,auVar103);
              fVar245 = auVar160._0_4_;
              fVar235 = auVar137._0_4_;
              auVar137 = vdpps_avx(auVar101,auVar102,0x7f);
              fVar235 = fVar235 * 1.5 + fVar245 * -0.5 * fVar235 * fVar235 * fVar235;
              auVar146._0_4_ = auVar102._0_4_ * fVar245;
              auVar146._4_4_ = auVar102._4_4_ * fVar245;
              auVar146._8_4_ = auVar102._8_4_ * fVar245;
              auVar146._12_4_ = auVar102._12_4_ * fVar245;
              fVar244 = auVar137._0_4_;
              auVar223._0_4_ = auVar101._0_4_ * fVar244;
              auVar223._4_4_ = auVar101._4_4_ * fVar244;
              fVar246 = auVar101._8_4_;
              auVar223._8_4_ = fVar246 * fVar244;
              fVar247 = auVar101._12_4_;
              auVar223._12_4_ = fVar247 * fVar244;
              auVar137 = vsubps_avx(auVar146,auVar223);
              auVar103 = vrcpss_avx(auVar103,auVar103);
              auVar102 = vfnmadd213ss_fma(auVar103,auVar160,auVar218);
              fVar244 = auVar103._0_4_ * auVar102._0_4_;
              auVar103 = vmaxss_avx(ZEXT416((uint)fVar203),
                                    ZEXT416((uint)(auVar267._0_4_ * (float)local_a00._0_4_)));
              auVar261 = ZEXT1664(auVar103);
              auVar239._0_8_ = auVar101._0_8_ ^ 0x8000000080000000;
              auVar239._8_4_ = -fVar246;
              auVar239._12_4_ = -fVar247;
              auVar194._0_4_ = fVar235 * auVar137._0_4_ * fVar244;
              auVar194._4_4_ = fVar235 * auVar137._4_4_ * fVar244;
              auVar194._8_4_ = fVar235 * auVar137._8_4_ * fVar244;
              auVar194._12_4_ = fVar235 * auVar137._12_4_ * fVar244;
              auVar266._0_4_ = auVar101._0_4_ * fVar235;
              auVar266._4_4_ = auVar101._4_4_ * fVar235;
              auVar266._8_4_ = fVar246 * fVar235;
              auVar266._12_4_ = fVar247 * fVar235;
              if (fVar245 < -fVar245) {
                local_a20._0_16_ = auVar239;
                auVar291 = ZEXT1664(auVar219);
                fVar235 = sqrtf(fVar245);
                auVar261 = ZEXT464(auVar103._0_4_);
                auVar112 = ZEXT416(auVar112._0_4_);
                auVar239 = local_a20._0_16_;
              }
              else {
                auVar160 = vsqrtss_avx(auVar160,auVar160);
                fVar235 = auVar160._0_4_;
              }
              auVar160 = vdpps_avx(_local_960,auVar266,0x7f);
              auVar136 = vfmadd213ss_fma(ZEXT416((uint)fVar203),auVar112,auVar261._0_16_);
              auVar137 = vdpps_avx(auVar239,auVar266,0x7f);
              auVar102 = vdpps_avx(_local_960,auVar194,0x7f);
              auVar138 = vdpps_avx(local_9d0,auVar266,0x7f);
              auVar136 = vfmadd213ss_fma(ZEXT416((uint)(auVar112._0_4_ + 1.0)),
                                         ZEXT416((uint)(fVar203 / fVar235)),auVar136);
              auVar276 = ZEXT1664(auVar136);
              fVar235 = auVar137._0_4_ + auVar102._0_4_;
              auVar281 = ZEXT464((uint)fVar235);
              fVar245 = auVar160._0_4_;
              auVar114._0_4_ = fVar245 * fVar245;
              auVar114._4_4_ = auVar160._4_4_ * auVar160._4_4_;
              auVar114._8_4_ = auVar160._8_4_ * auVar160._8_4_;
              auVar114._12_4_ = auVar160._12_4_ * auVar160._12_4_;
              auVar137 = vdpps_avx(_local_960,auVar239,0x7f);
              auVar112 = vsubps_avx(auVar104,auVar114);
              auVar102 = vrsqrtss_avx(auVar112,auVar112);
              fVar246 = auVar112._0_4_;
              fVar244 = auVar102._0_4_;
              fVar244 = fVar244 * 1.5 + fVar246 * -0.5 * fVar244 * fVar244 * fVar244;
              auVar102 = vdpps_avx(_local_960,local_9d0,0x7f);
              auVar137 = vfnmadd231ss_fma(auVar137,auVar160,ZEXT416((uint)fVar235));
              auVar102 = vfnmadd231ss_fma(auVar102,auVar160,auVar138);
              if (fVar246 < 0.0) {
                local_a20._0_4_ = auVar136._0_4_;
                local_a40._0_4_ = fVar244;
                local_9a0._0_16_ = auVar102;
                auVar291 = ZEXT1664(auVar291._0_16_);
                fVar246 = sqrtf(fVar246);
                auVar281 = ZEXT1664(ZEXT416((uint)fVar235));
                auVar276 = ZEXT464((uint)local_a20._0_4_);
                auVar261 = ZEXT464(auVar103._0_4_);
                fVar244 = (float)local_a40._0_4_;
                auVar102 = local_9a0._0_16_;
              }
              else {
                auVar103 = vsqrtss_avx(auVar112,auVar112);
                fVar246 = auVar103._0_4_;
              }
              auVar243 = ZEXT1664(auVar101);
              auVar103 = vpermilps_avx(local_840._0_16_,0xff);
              fVar246 = fVar246 - auVar103._0_4_;
              auVar112 = vshufps_avx(auVar101,auVar101,0xff);
              auVar103 = vfmsub213ss_fma(auVar137,ZEXT416((uint)fVar244),auVar112);
              auVar195._0_8_ = auVar138._0_8_ ^ 0x8000000080000000;
              auVar195._8_4_ = auVar138._8_4_ ^ 0x80000000;
              auVar195._12_4_ = auVar138._12_4_ ^ 0x80000000;
              auVar209._0_8_ = auVar103._0_8_ ^ 0x8000000080000000;
              auVar209._8_4_ = auVar103._8_4_ ^ 0x80000000;
              auVar209._12_4_ = auVar103._12_4_ ^ 0x80000000;
              auVar102 = ZEXT416((uint)(auVar102._0_4_ * fVar244));
              auVar136 = auVar281._0_16_;
              auVar137 = vfmsub231ss_fma(ZEXT416((uint)(auVar138._0_4_ * auVar103._0_4_)),auVar136,
                                         auVar102);
              auVar103 = vinsertps_avx(auVar209,auVar102,0x1c);
              uVar99 = auVar137._0_4_;
              auVar210._4_4_ = uVar99;
              auVar210._0_4_ = uVar99;
              auVar210._8_4_ = uVar99;
              auVar210._12_4_ = uVar99;
              auVar103 = vdivps_avx(auVar103,auVar210);
              auVar137 = vinsertps_avx(auVar136,auVar195,0x10);
              auVar137 = vdivps_avx(auVar137,auVar210);
              auVar171._0_4_ = fVar245 * auVar103._0_4_ + fVar246 * auVar137._0_4_;
              auVar171._4_4_ = fVar245 * auVar103._4_4_ + fVar246 * auVar137._4_4_;
              auVar171._8_4_ = fVar245 * auVar103._8_4_ + fVar246 * auVar137._8_4_;
              auVar171._12_4_ = fVar245 * auVar103._12_4_ + fVar246 * auVar137._12_4_;
              auVar137 = vsubps_avx(auVar107,auVar171);
              auVar267 = ZEXT1664(auVar137);
              auVar103 = vandps_avx(auVar160,auVar236);
              if (auVar103._0_4_ < auVar276._0_4_) {
                auVar160 = vfmadd231ss_fma(ZEXT416((uint)(auVar261._0_4_ + auVar276._0_4_)),
                                           local_860._0_16_,ZEXT416(0x36000000));
                auVar103 = vandps_avx(ZEXT416((uint)fVar246),auVar236);
                if (auVar103._0_4_ < auVar160._0_4_) {
                  fVar235 = auVar137._0_4_ + (float)local_920._0_4_;
                  if (fVar235 < fVar134) {
                    bVar87 = 0;
                    goto LAB_01612aa8;
                  }
                  fVar244 = *(float *)(ray + k * 4 + 0x100);
                  auVar261 = ZEXT464((uint)fVar244);
                  if (fVar235 <= fVar244) {
                    auVar103 = vmovshdup_avx(auVar137);
                    bVar87 = 0;
                    if ((auVar103._0_4_ < 0.0) || (1.0 < auVar103._0_4_)) goto LAB_01612aa8;
                    auVar104 = vrsqrtss_avx(auVar104,auVar104);
                    fVar245 = auVar104._0_4_;
                    pGVar3 = (context->scene->geometries).items[uVar88].ptr;
                    if ((pGVar3->mask & *(uint *)(ray + k * 4 + 0x120)) == 0) {
                      bVar87 = 0;
                      goto LAB_01612aa8;
                    }
                    if ((context->args->filter == (RTCFilterFunctionN)0x0) &&
                       (bVar87 = 1, pGVar3->occlusionFilterN == (RTCFilterFunctionN)0x0))
                    goto LAB_01612aa8;
                    fVar100 = fVar245 * 1.5 + fVar100 * -0.5 * fVar245 * fVar245 * fVar245;
                    auVar196._0_4_ = fVar100 * (float)local_960._0_4_;
                    auVar196._4_4_ = fVar100 * (float)local_960._4_4_;
                    auVar196._8_4_ = fVar100 * fStack_958;
                    auVar196._12_4_ = fVar100 * fStack_954;
                    auVar138 = vfmadd213ps_fma(auVar112,auVar196,auVar101);
                    auVar104 = vshufps_avx(auVar196,auVar196,0xc9);
                    auVar160 = vshufps_avx(auVar101,auVar101,0xc9);
                    auVar197._0_4_ = auVar196._0_4_ * auVar160._0_4_;
                    auVar197._4_4_ = auVar196._4_4_ * auVar160._4_4_;
                    auVar197._8_4_ = auVar196._8_4_ * auVar160._8_4_;
                    auVar197._12_4_ = auVar196._12_4_ * auVar160._12_4_;
                    auVar102 = vfmsub231ps_fma(auVar197,auVar101,auVar104);
                    auVar104 = vshufps_avx(auVar102,auVar102,0xc9);
                    auVar160 = vshufps_avx(auVar138,auVar138,0xc9);
                    auVar102 = vshufps_avx(auVar102,auVar102,0xd2);
                    auVar115._0_4_ = auVar138._0_4_ * auVar102._0_4_;
                    auVar115._4_4_ = auVar138._4_4_ * auVar102._4_4_;
                    auVar115._8_4_ = auVar138._8_4_ * auVar102._8_4_;
                    auVar115._12_4_ = auVar138._12_4_ * auVar102._12_4_;
                    auVar160 = vfmsub231ps_fma(auVar115,auVar104,auVar160);
                    local_3e0 = auVar103._0_8_;
                    auVar104 = vmovshdup_avx(auVar160);
                    local_440._8_8_ = auVar104._0_8_;
                    auVar104 = vshufps_avx(auVar160,auVar160,0xaa);
                    local_420 = auVar104._0_8_;
                    local_400 = auVar160._0_4_;
                    local_440._0_8_ = local_440._8_8_;
                    local_440._16_8_ = local_440._8_8_;
                    local_440._24_8_ = local_440._8_8_;
                    uStack_418 = local_420;
                    uStack_410 = local_420;
                    uStack_408 = local_420;
                    uStack_3fc = local_400;
                    uStack_3f8 = local_400;
                    uStack_3f4 = local_400;
                    uStack_3f0 = local_400;
                    uStack_3ec = local_400;
                    uStack_3e8 = local_400;
                    uStack_3e4 = local_400;
                    uStack_3d8 = local_3e0;
                    uStack_3d0 = local_3e0;
                    uStack_3c8 = local_3e0;
                    auVar172._12_4_ = 0;
                    auVar172._0_12_ = ZEXT812(0);
                    auVar172 = auVar172 << 0x20;
                    local_3c0 = ZEXT1232(ZEXT812(0)) << 0x20;
                    local_3a0 = CONCAT44(uStack_67c,local_680);
                    uStack_398 = CONCAT44(uStack_674,uStack_678);
                    uStack_390 = CONCAT44(uStack_66c,uStack_670);
                    uStack_388 = CONCAT44(uStack_664,uStack_668);
                    local_380._4_4_ = uStack_65c;
                    local_380._0_4_ = local_660;
                    local_380._8_4_ = uStack_658;
                    local_380._12_4_ = uStack_654;
                    local_380._16_4_ = uStack_650;
                    local_380._20_4_ = uStack_64c;
                    local_380._24_4_ = uStack_648;
                    local_380._28_4_ = uStack_644;
                    vpcmpeqd_avx2(local_380,local_380);
                    local_360 = context->user->instID[0];
                    uStack_35c = local_360;
                    uStack_358 = local_360;
                    uStack_354 = local_360;
                    uStack_350 = local_360;
                    uStack_34c = local_360;
                    uStack_348 = local_360;
                    uStack_344 = local_360;
                    local_340 = context->user->instPrimID[0];
                    uStack_33c = local_340;
                    uStack_338 = local_340;
                    uStack_334 = local_340;
                    uStack_330 = local_340;
                    uStack_32c = local_340;
                    uStack_328 = local_340;
                    uStack_324 = local_340;
                    *(float *)(ray + k * 4 + 0x100) = fVar235;
                    local_940 = local_6c0;
                    local_a90.valid = (int *)local_940;
                    local_a90.geometryUserPtr = pGVar3->userPtr;
                    local_a90.context = context->user;
                    local_a90.hit = (RTCHitN *)local_440;
                    local_a90.N = 8;
                    local_a90.ray = (RTCRayN *)ray;
                    if (pGVar3->occlusionFilterN != (RTCFilterFunctionN)0x0) {
                      auVar243 = ZEXT1664(auVar101);
                      auVar267 = ZEXT1664(auVar137);
                      auVar276 = ZEXT1664(auVar276._0_16_);
                      auVar281 = ZEXT1664(auVar136);
                      auVar291 = ZEXT1664(auVar291._0_16_);
                      (*pGVar3->occlusionFilterN)(&local_a90);
                      auVar172 = ZEXT816(0) << 0x40;
                    }
                    auVar183 = ZEXT1632(auVar172);
                    auVar117 = vpcmpeqd_avx2(local_940,auVar183);
                    auVar117 = _DAT_01fe9960 & ~auVar117;
                    if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                             (auVar117 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                            (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                           SUB321(auVar117 >> 0x7f,0) != '\0') ||
                          (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                         SUB321(auVar117 >> 0xbf,0) != '\0') ||
                        (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                        auVar117[0x1f] < '\0') {
                      p_Var4 = context->args->filter;
                      if ((p_Var4 != (RTCFilterFunctionN)0x0) &&
                         (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER) !=
                           RTC_RAY_QUERY_FLAG_INCOHERENT ||
                          (((pGVar3->field_8).field_0x2 & 0x40) != 0)))) {
                        auVar243 = ZEXT1664(auVar243._0_16_);
                        auVar267 = ZEXT1664(auVar267._0_16_);
                        auVar276 = ZEXT1664(auVar276._0_16_);
                        auVar281 = ZEXT1664(auVar281._0_16_);
                        auVar291 = ZEXT1664(auVar291._0_16_);
                        (*p_Var4)(&local_a90);
                        auVar183 = ZEXT832(0) << 0x40;
                      }
                      auVar261 = ZEXT464((uint)fVar244);
                      auVar183 = vpcmpeqd_avx2(local_940,auVar183);
                      auVar156._8_4_ = 0xff800000;
                      auVar156._0_8_ = 0xff800000ff800000;
                      auVar156._12_4_ = 0xff800000;
                      auVar156._16_4_ = 0xff800000;
                      auVar156._20_4_ = 0xff800000;
                      auVar156._24_4_ = 0xff800000;
                      auVar156._28_4_ = 0xff800000;
                      auVar117 = vblendvps_avx(auVar156,*(undefined1 (*) [32])
                                                         (local_a90.ray + 0x100),auVar183);
                      *(undefined1 (*) [32])(local_a90.ray + 0x100) = auVar117;
                      auVar117 = _DAT_01fe9960 & ~auVar183;
                      if ((((((((auVar117 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0
                               || (auVar117 >> 0x3f & (undefined1  [32])0x1) !=
                                  (undefined1  [32])0x0) ||
                              (auVar117 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0)
                             || SUB321(auVar117 >> 0x7f,0) != '\0') ||
                            (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                           SUB321(auVar117 >> 0xbf,0) != '\0') ||
                          (auVar117 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                          auVar117[0x1f] < '\0') {
                        bVar87 = 1;
                        goto LAB_01612aa8;
                      }
                    }
                    *(float *)(ray + k * 4 + 0x100) = fVar244;
                  }
                  auVar261 = ZEXT464((uint)fVar244);
                  bVar87 = 0;
                  goto LAB_01612aa8;
                }
              }
              bVar97 = uVar93 < 4;
              uVar93 = uVar93 + 1;
            } while (uVar93 != 5);
            bVar97 = false;
            bVar87 = 5;
LAB_01612aa8:
            bVar96 = (bool)(bVar96 | bVar97 & bVar87);
            uVar99 = *(undefined4 *)(ray + k * 4 + 0x100);
            auVar130._4_4_ = uVar99;
            auVar130._0_4_ = uVar99;
            auVar130._8_4_ = uVar99;
            auVar130._12_4_ = uVar99;
            auVar130._16_4_ = uVar99;
            auVar130._20_4_ = uVar99;
            auVar130._24_4_ = uVar99;
            auVar130._28_4_ = uVar99;
            auVar183 = vcmpps_avx(_local_8a0,auVar130,2);
            auVar117 = vandps_avx(auVar183,local_740);
            auVar183 = local_740 & auVar183;
            local_740 = auVar117;
          } while ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                        (auVar183 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                       (auVar183 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      SUB321(auVar183 >> 0x7f,0) != '\0') ||
                     (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                    SUB321(auVar183 >> 0xbf,0) != '\0') ||
                   (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   auVar183[0x1f] < '\0');
        }
        auVar184._0_4_ = (float)local_980._0_4_ + local_480._0_4_;
        auVar184._4_4_ = (float)local_980._4_4_ + local_480._4_4_;
        auVar184._8_4_ = fStack_978 + local_480._8_4_;
        auVar184._12_4_ = fStack_974 + local_480._12_4_;
        auVar184._16_4_ = fStack_970 + local_480._16_4_;
        auVar184._20_4_ = fStack_96c + local_480._20_4_;
        auVar184._24_4_ = fStack_968 + local_480._24_4_;
        auVar184._28_4_ = fStack_964 + local_480._28_4_;
        auVar183 = vcmpps_avx(auVar184,auVar130,2);
        auVar117 = vandps_avx(local_780,local_760);
        auVar117 = vandps_avx(auVar183,auVar117);
        auVar202._0_4_ = (float)local_980._0_4_ + local_320._0_4_;
        auVar202._4_4_ = (float)local_980._4_4_ + local_320._4_4_;
        auVar202._8_4_ = fStack_978 + local_320._8_4_;
        auVar202._12_4_ = fStack_974 + local_320._12_4_;
        auVar202._16_4_ = fStack_970 + local_320._16_4_;
        auVar202._20_4_ = fStack_96c + local_320._20_4_;
        auVar202._24_4_ = fStack_968 + local_320._24_4_;
        auVar202._28_4_ = fStack_964 + local_320._28_4_;
        auVar118 = vcmpps_avx(auVar202,auVar130,2);
        auVar183 = vandps_avx(local_900,local_8e0);
        auVar183 = vandps_avx(auVar118,auVar183);
        auVar183 = vorps_avx(auVar117,auVar183);
        if ((((((((auVar183 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                 (auVar183 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                (auVar183 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
               SUB321(auVar183 >> 0x7f,0) != '\0') ||
              (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
             SUB321(auVar183 >> 0xbf,0) != '\0') ||
            (auVar183 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
            auVar183[0x1f] < '\0') {
          *(undefined1 (*) [32])(auStack_180 + uVar94 * 0x60) = auVar183;
          auVar117 = vblendvps_avx(local_320,local_480,auVar117);
          *(undefined1 (*) [32])(auStack_160 + uVar94 * 0x60) = auVar117;
          uVar1 = vmovlps_avx(local_6d0);
          (&uStack_140)[uVar94 * 0xc] = uVar1;
          aiStack_138[uVar94 * 0x18] = local_ca8 + 1;
          iVar89 = iVar89 + 1;
        }
      }
    }
    if (iVar89 == 0) break;
    uVar99 = *(undefined4 *)(ray + k * 4 + 0x100);
    auVar127._4_4_ = uVar99;
    auVar127._0_4_ = uVar99;
    auVar127._8_4_ = uVar99;
    auVar127._12_4_ = uVar99;
    auVar127._16_4_ = uVar99;
    auVar127._20_4_ = uVar99;
    auVar127._24_4_ = uVar99;
    auVar127._28_4_ = uVar99;
    uVar91 = -iVar89;
    pauVar90 = (undefined1 (*) [32])(auStack_180 + (ulong)(iVar89 - 1) * 0x60);
    fVar203 = (float)local_980._0_4_;
    fVar100 = (float)local_980._4_4_;
    fVar235 = fStack_978;
    fVar244 = fStack_974;
    fVar245 = fStack_970;
    fVar246 = fStack_96c;
    fVar247 = fStack_968;
    fVar248 = fStack_964;
    while( true ) {
      auVar117 = pauVar90[1];
      auVar151._0_4_ = fVar203 + auVar117._0_4_;
      auVar151._4_4_ = fVar100 + auVar117._4_4_;
      auVar151._8_4_ = fVar235 + auVar117._8_4_;
      auVar151._12_4_ = fVar244 + auVar117._12_4_;
      auVar151._16_4_ = fVar245 + auVar117._16_4_;
      auVar151._20_4_ = fVar246 + auVar117._20_4_;
      auVar151._24_4_ = fVar247 + auVar117._24_4_;
      auVar151._28_4_ = fVar248 + auVar117._28_4_;
      auVar118 = vcmpps_avx(auVar151,auVar127,2);
      auVar183 = vandps_avx(auVar118,*pauVar90);
      local_440 = auVar183;
      auVar118 = *pauVar90 & auVar118;
      if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
               (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
              (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
             SUB321(auVar118 >> 0x7f,0) != '\0') ||
            (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
           SUB321(auVar118 >> 0xbf,0) != '\0') ||
          (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
          auVar118[0x1f] < '\0') break;
      pauVar90 = pauVar90 + -3;
      uVar91 = uVar91 + 1;
      fVar203 = (float)local_980._0_4_;
      fVar100 = (float)local_980._4_4_;
      fVar235 = fStack_978;
      fVar244 = fStack_974;
      fVar245 = fStack_970;
      fVar246 = fStack_96c;
      fVar247 = fStack_968;
      fVar248 = fStack_964;
      if (uVar91 == 0) goto LAB_01612f9e;
    }
    auVar128._8_4_ = 0x7f800000;
    auVar128._0_8_ = 0x7f8000007f800000;
    auVar128._12_4_ = 0x7f800000;
    auVar128._16_4_ = 0x7f800000;
    auVar128._20_4_ = 0x7f800000;
    auVar128._24_4_ = 0x7f800000;
    auVar128._28_4_ = 0x7f800000;
    auVar117 = vblendvps_avx(auVar128,auVar117,auVar183);
    auVar118 = vshufps_avx(auVar117,auVar117,0xb1);
    auVar118 = vminps_avx(auVar117,auVar118);
    auVar12 = vshufpd_avx(auVar118,auVar118,5);
    auVar118 = vminps_avx(auVar118,auVar12);
    auVar12 = vpermpd_avx2(auVar118,0x4e);
    auVar118 = vminps_avx(auVar118,auVar12);
    auVar117 = vcmpps_avx(auVar117,auVar118,0);
    auVar118 = auVar183 & auVar117;
    if ((((((((auVar118 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (auVar118 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (auVar118 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(auVar118 >> 0x7f,0) != '\0') ||
          (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(auVar118 >> 0xbf,0) != '\0') ||
        (auVar118 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        auVar118[0x1f] < '\0') {
      auVar183 = vandps_avx(auVar117,auVar183);
    }
    uVar93 = *(ulong *)pauVar90[2];
    auVar105._8_8_ = 0;
    auVar105._0_8_ = uVar93;
    uVar92 = vmovmskps_avx(auVar183);
    iVar89 = 0;
    for (; (uVar92 & 1) == 0; uVar92 = uVar92 >> 1 | 0x80000000) {
      iVar89 = iVar89 + 1;
    }
    *(undefined4 *)(local_440 + (uint)(iVar89 << 2)) = 0;
    uVar92 = ~uVar91;
    if ((((((((local_440 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
             (local_440 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
            (local_440 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
           SUB321(local_440 >> 0x7f,0) != '\0') ||
          (local_440 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
         SUB321(local_440 >> 0xbf,0) != '\0') ||
        (local_440 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
        local_440[0x1f] < '\0') {
      uVar92 = -uVar91;
    }
    uVar94 = (ulong)uVar92;
    local_ca8 = *(int *)(pauVar90[2] + 8);
    *pauVar90 = local_440;
    uVar99 = (undefined4)uVar93;
    auVar152._4_4_ = uVar99;
    auVar152._0_4_ = uVar99;
    auVar152._8_4_ = uVar99;
    auVar152._12_4_ = uVar99;
    auVar152._16_4_ = uVar99;
    auVar152._20_4_ = uVar99;
    auVar152._24_4_ = uVar99;
    auVar152._28_4_ = uVar99;
    auVar104 = vmovshdup_avx(auVar105);
    auVar104 = vsubps_avx(auVar104,auVar105);
    auVar129._0_4_ = auVar104._0_4_;
    auVar129._4_4_ = auVar129._0_4_;
    auVar129._8_4_ = auVar129._0_4_;
    auVar129._12_4_ = auVar129._0_4_;
    auVar129._16_4_ = auVar129._0_4_;
    auVar129._20_4_ = auVar129._0_4_;
    auVar129._24_4_ = auVar129._0_4_;
    auVar129._28_4_ = auVar129._0_4_;
    auVar104 = vfmadd132ps_fma(auVar129,auVar152,_DAT_01faff20);
    local_480 = ZEXT1632(auVar104);
    local_6d0._8_8_ = 0;
    local_6d0._0_8_ = *(ulong *)(local_480 + (uint)(iVar89 << 2));
  } while( true );
LAB_01612f9e:
  if (bVar96 != false) {
    return bVar96;
  }
  uVar99 = *(undefined4 *)(ray + k * 4 + 0x100);
  auVar116._4_4_ = uVar99;
  auVar116._0_4_ = uVar99;
  auVar116._8_4_ = uVar99;
  auVar116._12_4_ = uVar99;
  auVar5 = vcmpps_avx(local_6e0,auVar116,2);
  uVar88 = vmovmskps_avx(auVar5);
  uVar88 = (uint)local_908 & uVar88;
  if (uVar88 == 0) {
    return false;
  }
  goto LAB_016105dc;
}

Assistant:

static __forceinline bool occluded_t(Precalculations& pre, RayK<K>& ray, const size_t k, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,k,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          Vec3ff a0,a1,a2,a3; geom->gather(a0,a1,a2,a3,geom->curve(primID));

          size_t mask1 = mask;
          const size_t i1 = bscf(mask1);
          if (mask) {
            const unsigned int primID1 = prim.primID(N)[i1];
            geom->prefetchL1_vertices(geom->curve(primID1));
            if (mask1) {
              const size_t i2 = bsf(mask1);
              const unsigned int primID2 = prim.primID(N)[i2];
              geom->prefetchL2_vertices(geom->curve(primID2));
            }
          }
          
          if (Intersector().intersect(pre,ray,k,context,geom,primID,a0,a1,a2,a3,Epilog(ray,k,context,geomID,primID)))
            return true;
          
          mask &= movemask(tNear <= vfloat<M>(ray.tfar[k]));
        }
        return false;
      }